

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_hn<embree::sse2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Primitive PVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  __int_type_conflict _Var15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined3 uVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  bool bVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined6 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  byte bVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  RTCFilterFunctionN p_Var56;
  RTCRayN *pRVar57;
  int iVar58;
  ulong uVar59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  bool bVar63;
  uint uVar64;
  uint uVar65;
  int iVar66;
  uint uVar67;
  uint uVar68;
  short sVar69;
  float t1;
  undefined2 uVar99;
  float fVar70;
  float fVar100;
  float fVar101;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar102;
  float fVar121;
  float fVar122;
  undefined1 auVar103 [16];
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar123;
  float fVar140;
  float fVar141;
  vfloat4 v;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar158;
  float fVar159;
  vfloat4 v_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  float fVar160;
  float fVar163;
  float fVar164;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar165;
  float fVar189;
  float fVar190;
  vfloat_impl<4> p00;
  undefined1 auVar166 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar191;
  float fVar201;
  float fVar202;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar203;
  float fVar212;
  float fVar213;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar215;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar255;
  float fVar258;
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar256;
  float fVar257;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar274;
  float fVar277;
  vfloat4 a;
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  float fVar275;
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar293;
  float fVar296;
  vfloat4 a_2;
  float fVar299;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar289 [16];
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar298;
  float fVar300;
  float fVar301;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar302;
  float fVar303;
  float fVar312;
  float fVar314;
  float fVar316;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar308 [16];
  float fVar313;
  float fVar315;
  float fVar317;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  float fVar318;
  float fVar319;
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar331;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_54d;
  uint local_54c;
  float fStack_540;
  float fStack_53c;
  undefined8 local_538;
  undefined8 local_4c8;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 *local_400;
  Primitive *local_3f8;
  long local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 auStack_58 [5];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 uVar98;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar156 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  
  PVar10 = prim[1];
  uVar52 = (ulong)(byte)PVar10;
  lVar18 = uVar52 * 0x25;
  pPVar4 = prim + lVar18 + 6;
  fVar141 = *(float *)(pPVar4 + 0xc);
  fVar142 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar141;
  fVar158 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar141;
  fVar159 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar141;
  fVar123 = *(float *)(ray + k * 4 + 0x40) * fVar141;
  fVar140 = *(float *)(ray + k * 4 + 0x50) * fVar141;
  fVar141 = *(float *)(ray + k * 4 + 0x60) * fVar141;
  uVar11 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar29,sVar69);
  auVar248._8_4_ = 0;
  auVar248._0_8_ = uVar60;
  auVar248._12_2_ = uVar99;
  auVar248._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar125._12_4_ = auVar248._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar60;
  auVar125._10_2_ = uVar99;
  auVar71._10_6_ = auVar125._10_6_;
  auVar71._8_2_ = uVar99;
  auVar71._0_8_ = uVar60;
  uVar99 = (undefined2)uVar29;
  auVar30._4_8_ = auVar71._8_8_;
  auVar30._2_2_ = uVar99;
  auVar30._0_2_ = uVar99;
  fVar318 = (float)((int)sVar69 >> 8);
  fVar323 = (float)(auVar30._0_4_ >> 0x18);
  fVar324 = (float)(auVar71._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar29,sVar69);
  auVar105._8_4_ = 0;
  auVar105._0_8_ = uVar60;
  auVar105._12_2_ = uVar99;
  auVar105._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar104._12_4_ = auVar105._12_4_;
  auVar104._8_2_ = 0;
  auVar104._0_8_ = uVar60;
  auVar104._10_2_ = uVar99;
  auVar103._10_6_ = auVar104._10_6_;
  auVar103._8_2_ = uVar99;
  auVar103._0_8_ = uVar60;
  uVar99 = (undefined2)uVar29;
  auVar31._4_8_ = auVar103._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  fVar160 = (float)((int)sVar69 >> 8);
  fVar163 = (float)(auVar31._0_4_ >> 0x18);
  fVar164 = (float)(auVar103._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar29,sVar69);
  auVar108._8_4_ = 0;
  auVar108._0_8_ = uVar60;
  auVar108._12_2_ = uVar99;
  auVar108._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._8_2_ = 0;
  auVar107._0_8_ = uVar60;
  auVar107._10_2_ = uVar99;
  auVar106._10_6_ = auVar107._10_6_;
  auVar106._8_2_ = uVar99;
  auVar106._0_8_ = uVar60;
  uVar99 = (undefined2)uVar29;
  auVar32._4_8_ = auVar106._8_8_;
  auVar32._2_2_ = uVar99;
  auVar32._0_2_ = uVar99;
  fVar191 = (float)((int)sVar69 >> 8);
  fVar201 = (float)(auVar32._0_4_ >> 0x18);
  fVar202 = (float)(auVar106._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar52 * 0xf + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar29,sVar69);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar60;
  auVar111._12_2_ = uVar99;
  auVar111._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar60;
  auVar110._10_2_ = uVar99;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar99;
  auVar109._0_8_ = uVar60;
  uVar99 = (undefined2)uVar29;
  auVar33._4_8_ = auVar109._8_8_;
  auVar33._2_2_ = uVar99;
  auVar33._0_2_ = uVar99;
  fVar70 = (float)((int)sVar69 >> 8);
  fVar100 = (float)(auVar33._0_4_ >> 0x18);
  fVar101 = (float)(auVar109._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar29,sVar69);
  auVar168._8_4_ = 0;
  auVar168._0_8_ = uVar60;
  auVar168._12_2_ = uVar99;
  auVar168._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._8_2_ = 0;
  auVar167._0_8_ = uVar60;
  auVar167._10_2_ = uVar99;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._8_2_ = uVar99;
  auVar166._0_8_ = uVar60;
  uVar99 = (undefined2)uVar29;
  auVar34._4_8_ = auVar166._8_8_;
  auVar34._2_2_ = uVar99;
  auVar34._0_2_ = uVar99;
  fVar203 = (float)((int)sVar69 >> 8);
  fVar212 = (float)(auVar34._0_4_ >> 0x18);
  fVar213 = (float)(auVar166._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar52 + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar29,sVar69);
  auVar171._8_4_ = 0;
  auVar171._0_8_ = uVar60;
  auVar171._12_2_ = uVar99;
  auVar171._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar170._12_4_ = auVar171._12_4_;
  auVar170._8_2_ = 0;
  auVar170._0_8_ = uVar60;
  auVar170._10_2_ = uVar99;
  auVar169._10_6_ = auVar170._10_6_;
  auVar169._8_2_ = uVar99;
  auVar169._0_8_ = uVar60;
  uVar99 = (undefined2)uVar29;
  auVar35._4_8_ = auVar169._8_8_;
  auVar35._2_2_ = uVar99;
  auVar35._0_2_ = uVar99;
  fVar241 = (float)((int)sVar69 >> 8);
  fVar255 = (float)(auVar35._0_4_ >> 0x18);
  fVar258 = (float)(auVar169._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar52 * 0x1a + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar29,sVar69);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar60;
  auVar174._12_2_ = uVar99;
  auVar174._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar60;
  auVar173._10_2_ = uVar99;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar99;
  auVar172._0_8_ = uVar60;
  uVar99 = (undefined2)uVar29;
  auVar36._4_8_ = auVar172._8_8_;
  auVar36._2_2_ = uVar99;
  auVar36._0_2_ = uVar99;
  fVar214 = (float)((int)sVar69 >> 8);
  fVar225 = (float)(auVar36._0_4_ >> 0x18);
  fVar230 = (float)(auVar172._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar52 * 0x1b + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar29,sVar69);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar60;
  auVar177._12_2_ = uVar99;
  auVar177._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar60;
  auVar176._10_2_ = uVar99;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar99;
  auVar175._0_8_ = uVar60;
  uVar99 = (undefined2)uVar29;
  auVar37._4_8_ = auVar175._8_8_;
  auVar37._2_2_ = uVar99;
  auVar37._0_2_ = uVar99;
  fVar263 = (float)((int)sVar69 >> 8);
  fVar274 = (float)(auVar37._0_4_ >> 0x18);
  fVar277 = (float)(auVar175._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar52 * 0x1c + 6);
  uVar98 = (undefined1)((uint)uVar11 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar11 >> 0x10);
  uVar27 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar11));
  uVar98 = (undefined1)((uint)uVar11 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar27 >> 0x20),uVar98),uVar98);
  sVar69 = CONCAT11((char)uVar11,(char)uVar11);
  uVar60 = CONCAT62(uVar29,sVar69);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar60;
  auVar180._12_2_ = uVar99;
  auVar180._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar27 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar60;
  auVar179._10_2_ = uVar99;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar99;
  auVar178._0_8_ = uVar60;
  uVar99 = (undefined2)uVar29;
  auVar38._4_8_ = auVar178._8_8_;
  auVar38._2_2_ = uVar99;
  auVar38._0_2_ = uVar99;
  fVar102 = (float)((int)sVar69 >> 8);
  fVar121 = (float)(auVar38._0_4_ >> 0x18);
  fVar122 = (float)(auVar178._8_4_ >> 0x18);
  fVar302 = fVar123 * fVar318 + fVar140 * fVar160 + fVar141 * fVar191;
  fVar312 = fVar123 * fVar323 + fVar140 * fVar163 + fVar141 * fVar201;
  fVar314 = fVar123 * fVar324 + fVar140 * fVar164 + fVar141 * fVar202;
  fVar316 = fVar123 * (float)(auVar125._12_4_ >> 0x18) +
            fVar140 * (float)(auVar104._12_4_ >> 0x18) + fVar141 * (float)(auVar107._12_4_ >> 0x18);
  fVar282 = fVar123 * fVar70 + fVar140 * fVar203 + fVar141 * fVar241;
  fVar293 = fVar123 * fVar100 + fVar140 * fVar212 + fVar141 * fVar255;
  fVar296 = fVar123 * fVar101 + fVar140 * fVar213 + fVar141 * fVar258;
  fVar299 = fVar123 * (float)(auVar110._12_4_ >> 0x18) +
            fVar140 * (float)(auVar167._12_4_ >> 0x18) + fVar141 * (float)(auVar170._12_4_ >> 0x18);
  fVar165 = fVar123 * fVar214 + fVar140 * fVar263 + fVar141 * fVar102;
  fVar189 = fVar123 * fVar225 + fVar140 * fVar274 + fVar141 * fVar121;
  fVar190 = fVar123 * fVar230 + fVar140 * fVar277 + fVar141 * fVar122;
  fVar123 = fVar123 * (float)(auVar173._12_4_ >> 0x18) +
            fVar140 * (float)(auVar176._12_4_ >> 0x18) + fVar141 * (float)(auVar179._12_4_ >> 0x18);
  fVar319 = fVar318 * fVar142 + fVar160 * fVar158 + fVar191 * fVar159;
  fVar323 = fVar323 * fVar142 + fVar163 * fVar158 + fVar201 * fVar159;
  fVar324 = fVar324 * fVar142 + fVar164 * fVar158 + fVar202 * fVar159;
  fVar325 = (float)(auVar125._12_4_ >> 0x18) * fVar142 +
            (float)(auVar104._12_4_ >> 0x18) * fVar158 + (float)(auVar107._12_4_ >> 0x18) * fVar159;
  fVar241 = fVar70 * fVar142 + fVar203 * fVar158 + fVar241 * fVar159;
  fVar255 = fVar100 * fVar142 + fVar212 * fVar158 + fVar255 * fVar159;
  fVar258 = fVar101 * fVar142 + fVar213 * fVar158 + fVar258 * fVar159;
  fVar318 = (float)(auVar110._12_4_ >> 0x18) * fVar142 +
            (float)(auVar167._12_4_ >> 0x18) * fVar158 + (float)(auVar170._12_4_ >> 0x18) * fVar159;
  fVar214 = fVar142 * fVar214 + fVar158 * fVar263 + fVar159 * fVar102;
  fVar225 = fVar142 * fVar225 + fVar158 * fVar274 + fVar159 * fVar121;
  fVar230 = fVar142 * fVar230 + fVar158 * fVar277 + fVar159 * fVar122;
  fVar263 = fVar142 * (float)(auVar173._12_4_ >> 0x18) +
            fVar158 * (float)(auVar176._12_4_ >> 0x18) + fVar159 * (float)(auVar179._12_4_ >> 0x18);
  fVar141 = (float)DAT_01ff1d40;
  fVar70 = DAT_01ff1d40._4_4_;
  fVar100 = DAT_01ff1d40._8_4_;
  fVar101 = DAT_01ff1d40._12_4_;
  uVar64 = -(uint)(fVar141 <= ABS(fVar302));
  uVar65 = -(uint)(fVar70 <= ABS(fVar312));
  uVar67 = -(uint)(fVar100 <= ABS(fVar314));
  uVar68 = -(uint)(fVar101 <= ABS(fVar316));
  auVar304._0_4_ = (uint)fVar302 & uVar64;
  auVar304._4_4_ = (uint)fVar312 & uVar65;
  auVar304._8_4_ = (uint)fVar314 & uVar67;
  auVar304._12_4_ = (uint)fVar316 & uVar68;
  auVar143._0_4_ = ~uVar64 & (uint)fVar141;
  auVar143._4_4_ = ~uVar65 & (uint)fVar70;
  auVar143._8_4_ = ~uVar67 & (uint)fVar100;
  auVar143._12_4_ = ~uVar68 & (uint)fVar101;
  auVar143 = auVar143 | auVar304;
  uVar64 = -(uint)(fVar141 <= ABS(fVar282));
  uVar65 = -(uint)(fVar70 <= ABS(fVar293));
  uVar67 = -(uint)(fVar100 <= ABS(fVar296));
  uVar68 = -(uint)(fVar101 <= ABS(fVar299));
  auVar285._0_4_ = (uint)fVar282 & uVar64;
  auVar285._4_4_ = (uint)fVar293 & uVar65;
  auVar285._8_4_ = (uint)fVar296 & uVar67;
  auVar285._12_4_ = (uint)fVar299 & uVar68;
  auVar192._0_4_ = ~uVar64 & (uint)fVar141;
  auVar192._4_4_ = ~uVar65 & (uint)fVar70;
  auVar192._8_4_ = ~uVar67 & (uint)fVar100;
  auVar192._12_4_ = ~uVar68 & (uint)fVar101;
  auVar192 = auVar192 | auVar285;
  uVar64 = -(uint)(fVar141 <= ABS(fVar165));
  uVar65 = -(uint)(fVar70 <= ABS(fVar189));
  uVar67 = -(uint)(fVar100 <= ABS(fVar190));
  uVar68 = -(uint)(fVar101 <= ABS(fVar123));
  auVar181._0_4_ = (uint)fVar165 & uVar64;
  auVar181._4_4_ = (uint)fVar189 & uVar65;
  auVar181._8_4_ = (uint)fVar190 & uVar67;
  auVar181._12_4_ = (uint)fVar123 & uVar68;
  auVar204._0_4_ = ~uVar64 & (uint)fVar141;
  auVar204._4_4_ = ~uVar65 & (uint)fVar70;
  auVar204._8_4_ = ~uVar67 & (uint)fVar100;
  auVar204._12_4_ = ~uVar68 & (uint)fVar101;
  auVar204 = auVar204 | auVar181;
  auVar71 = rcpps(_DAT_01ff1d40,auVar143);
  fVar141 = auVar71._0_4_;
  fVar101 = auVar71._4_4_;
  fVar160 = auVar71._8_4_;
  fVar203 = auVar71._12_4_;
  fVar141 = (1.0 - auVar143._0_4_ * fVar141) * fVar141 + fVar141;
  fVar101 = (1.0 - auVar143._4_4_ * fVar101) * fVar101 + fVar101;
  fVar160 = (1.0 - auVar143._8_4_ * fVar160) * fVar160 + fVar160;
  fVar203 = (1.0 - auVar143._12_4_ * fVar203) * fVar203 + fVar203;
  auVar71 = rcpps(auVar71,auVar192);
  fVar70 = auVar71._0_4_;
  fVar102 = auVar71._4_4_;
  fVar163 = auVar71._8_4_;
  fVar212 = auVar71._12_4_;
  fVar70 = (1.0 - auVar192._0_4_ * fVar70) * fVar70 + fVar70;
  fVar102 = (1.0 - auVar192._4_4_ * fVar102) * fVar102 + fVar102;
  fVar163 = (1.0 - auVar192._8_4_ * fVar163) * fVar163 + fVar163;
  fVar212 = (1.0 - auVar192._12_4_ * fVar212) * fVar212 + fVar212;
  auVar71 = rcpps(auVar71,auVar204);
  fVar100 = auVar71._0_4_;
  fVar121 = auVar71._4_4_;
  fVar164 = auVar71._8_4_;
  fVar213 = auVar71._12_4_;
  fVar100 = (1.0 - auVar204._0_4_ * fVar100) * fVar100 + fVar100;
  fVar121 = (1.0 - auVar204._4_4_ * fVar121) * fVar121 + fVar121;
  fVar164 = (1.0 - auVar204._8_4_ * fVar164) * fVar164 + fVar164;
  fVar213 = (1.0 - auVar204._12_4_ * fVar213) * fVar213 + fVar213;
  fVar274 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar18 + 0x16)) *
            *(float *)(prim + lVar18 + 0x1a);
  uVar60 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar99 = (undefined2)(uVar60 >> 0x30);
  auVar327._8_4_ = 0;
  auVar327._0_8_ = uVar60;
  auVar327._12_2_ = uVar99;
  auVar327._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar60 >> 0x20);
  auVar127._12_4_ = auVar327._12_4_;
  auVar127._8_2_ = 0;
  auVar127._0_8_ = uVar60;
  auVar127._10_2_ = uVar99;
  auVar72._10_6_ = auVar127._10_6_;
  auVar72._8_2_ = uVar99;
  auVar72._0_8_ = uVar60;
  uVar99 = (undefined2)(uVar60 >> 0x10);
  auVar39._4_8_ = auVar72._8_8_;
  auVar39._2_2_ = uVar99;
  auVar39._0_2_ = uVar99;
  fVar122 = (float)(auVar39._0_4_ >> 0x10);
  fVar165 = (float)(auVar72._8_4_ >> 0x10);
  uVar53 = *(ulong *)(prim + uVar52 * 0xb + 6);
  uVar99 = (undefined2)(uVar53 >> 0x30);
  auVar146._8_4_ = 0;
  auVar146._0_8_ = uVar53;
  auVar146._12_2_ = uVar99;
  auVar146._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar53 >> 0x20);
  auVar145._12_4_ = auVar146._12_4_;
  auVar145._8_2_ = 0;
  auVar145._0_8_ = uVar53;
  auVar145._10_2_ = uVar99;
  auVar144._10_6_ = auVar145._10_6_;
  auVar144._8_2_ = uVar99;
  auVar144._0_8_ = uVar53;
  uVar99 = (undefined2)(uVar53 >> 0x10);
  auVar40._4_8_ = auVar144._8_8_;
  auVar40._2_2_ = uVar99;
  auVar40._0_2_ = uVar99;
  uVar54 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar54;
  auVar75._12_2_ = uVar99;
  auVar75._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar54;
  auVar74._10_2_ = uVar99;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar99;
  auVar73._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar41._4_8_ = auVar73._8_8_;
  auVar41._2_2_ = uVar99;
  auVar41._0_2_ = uVar99;
  fVar123 = (float)(auVar41._0_4_ >> 0x10);
  fVar189 = (float)(auVar73._8_4_ >> 0x10);
  uVar55 = *(ulong *)(prim + uVar52 * 0xd + 6);
  uVar99 = (undefined2)(uVar55 >> 0x30);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar55;
  auVar207._12_2_ = uVar99;
  auVar207._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar55 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar55;
  auVar206._10_2_ = uVar99;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar99;
  auVar205._0_8_ = uVar55;
  uVar99 = (undefined2)(uVar55 >> 0x10);
  auVar42._4_8_ = auVar205._8_8_;
  auVar42._2_2_ = uVar99;
  auVar42._0_2_ = uVar99;
  uVar59 = *(ulong *)(prim + uVar52 * 0x12 + 6);
  uVar99 = (undefined2)(uVar59 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar59;
  auVar78._12_2_ = uVar99;
  auVar78._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar59 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar59;
  auVar77._10_2_ = uVar99;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar99;
  auVar76._0_8_ = uVar59;
  uVar99 = (undefined2)(uVar59 >> 0x10);
  auVar43._4_8_ = auVar76._8_8_;
  auVar43._2_2_ = uVar99;
  auVar43._0_2_ = uVar99;
  fVar140 = (float)(auVar43._0_4_ >> 0x10);
  fVar190 = (float)(auVar76._8_4_ >> 0x10);
  uVar62 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  uVar5 = *(ulong *)(prim + uVar52 * 2 + uVar62 + 6);
  uVar99 = (undefined2)(uVar5 >> 0x30);
  auVar246._8_4_ = 0;
  auVar246._0_8_ = uVar5;
  auVar246._12_2_ = uVar99;
  auVar246._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar5 >> 0x20);
  auVar245._12_4_ = auVar246._12_4_;
  auVar245._8_2_ = 0;
  auVar245._0_8_ = uVar5;
  auVar245._10_2_ = uVar99;
  auVar244._10_6_ = auVar245._10_6_;
  auVar244._8_2_ = uVar99;
  auVar244._0_8_ = uVar5;
  uVar99 = (undefined2)(uVar5 >> 0x10);
  auVar44._4_8_ = auVar244._8_8_;
  auVar44._2_2_ = uVar99;
  auVar44._0_2_ = uVar99;
  uVar62 = *(ulong *)(prim + uVar62 + 6);
  uVar99 = (undefined2)(uVar62 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar62;
  auVar81._12_2_ = uVar99;
  auVar81._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar62 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar62;
  auVar80._10_2_ = uVar99;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar99;
  auVar79._0_8_ = uVar62;
  uVar99 = (undefined2)(uVar62 >> 0x10);
  auVar45._4_8_ = auVar79._8_8_;
  auVar45._2_2_ = uVar99;
  auVar45._0_2_ = uVar99;
  fVar142 = (float)(auVar45._0_4_ >> 0x10);
  fVar191 = (float)(auVar79._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar52 * 0x18 + 6);
  uVar99 = (undefined2)(uVar6 >> 0x30);
  auVar268._8_4_ = 0;
  auVar268._0_8_ = uVar6;
  auVar268._12_2_ = uVar99;
  auVar268._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar6 >> 0x20);
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar6;
  auVar267._10_2_ = uVar99;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._8_2_ = uVar99;
  auVar266._0_8_ = uVar6;
  uVar99 = (undefined2)(uVar6 >> 0x10);
  auVar46._4_8_ = auVar266._8_8_;
  auVar46._2_2_ = uVar99;
  auVar46._0_2_ = uVar99;
  uVar7 = *(ulong *)(prim + uVar52 * 0x1d + 6);
  uVar99 = (undefined2)(uVar7 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar7;
  auVar84._12_2_ = uVar99;
  auVar84._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar7 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar7;
  auVar83._10_2_ = uVar99;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar99;
  auVar82._0_8_ = uVar7;
  uVar99 = (undefined2)(uVar7 >> 0x10);
  auVar47._4_8_ = auVar82._8_8_;
  auVar47._2_2_ = uVar99;
  auVar47._0_2_ = uVar99;
  fVar158 = (float)(auVar47._0_4_ >> 0x10);
  fVar201 = (float)(auVar82._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar52 + (ulong)(byte)PVar10 * 0x20 + 6);
  uVar99 = (undefined2)(uVar8 >> 0x30);
  auVar288._8_4_ = 0;
  auVar288._0_8_ = uVar8;
  auVar288._12_2_ = uVar99;
  auVar288._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar8 >> 0x20);
  auVar287._12_4_ = auVar288._12_4_;
  auVar287._8_2_ = 0;
  auVar287._0_8_ = uVar8;
  auVar287._10_2_ = uVar99;
  auVar286._10_6_ = auVar287._10_6_;
  auVar286._8_2_ = uVar99;
  auVar286._0_8_ = uVar8;
  uVar99 = (undefined2)(uVar8 >> 0x10);
  auVar48._4_8_ = auVar286._8_8_;
  auVar48._2_2_ = uVar99;
  auVar48._0_2_ = uVar99;
  uVar9 = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar52) + 6);
  uVar99 = (undefined2)(uVar9 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar9;
  auVar87._12_2_ = uVar99;
  auVar87._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar9 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar9;
  auVar86._10_2_ = uVar99;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar99;
  auVar85._0_8_ = uVar9;
  uVar99 = (undefined2)(uVar9 >> 0x10);
  auVar49._4_8_ = auVar85._8_8_;
  auVar49._2_2_ = uVar99;
  auVar49._0_2_ = uVar99;
  fVar159 = (float)(auVar49._0_4_ >> 0x10);
  fVar202 = (float)(auVar85._8_4_ >> 0x10);
  uVar52 = *(ulong *)(prim + uVar52 * 0x23 + 6);
  uVar99 = (undefined2)(uVar52 >> 0x30);
  auVar307._8_4_ = 0;
  auVar307._0_8_ = uVar52;
  auVar307._12_2_ = uVar99;
  auVar307._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar52 >> 0x20);
  auVar306._12_4_ = auVar307._12_4_;
  auVar306._8_2_ = 0;
  auVar306._0_8_ = uVar52;
  auVar306._10_2_ = uVar99;
  auVar305._10_6_ = auVar306._10_6_;
  auVar305._8_2_ = uVar99;
  auVar305._0_8_ = uVar52;
  uVar99 = (undefined2)(uVar52 >> 0x10);
  auVar50._4_8_ = auVar305._8_8_;
  auVar50._2_2_ = uVar99;
  auVar50._0_2_ = uVar99;
  auVar147._0_8_ =
       CONCAT44(((((float)(auVar40._0_4_ >> 0x10) - fVar122) * fVar274 + fVar122) - fVar323) *
                fVar101,((((float)(int)(short)uVar53 - (float)(int)(short)uVar60) * fVar274 +
                         (float)(int)(short)uVar60) - fVar319) * fVar141);
  auVar147._8_4_ =
       ((((float)(auVar144._8_4_ >> 0x10) - fVar165) * fVar274 + fVar165) - fVar324) * fVar160;
  auVar147._12_4_ =
       ((((float)(auVar145._12_4_ >> 0x10) - (float)(auVar127._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar127._12_4_ >> 0x10)) - fVar325) * fVar203;
  auVar208._0_4_ =
       ((((float)(int)(short)uVar55 - (float)(int)(short)uVar54) * fVar274 +
        (float)(int)(short)uVar54) - fVar319) * fVar141;
  auVar208._4_4_ =
       ((((float)(auVar42._0_4_ >> 0x10) - fVar123) * fVar274 + fVar123) - fVar323) * fVar101;
  auVar208._8_4_ =
       ((((float)(auVar205._8_4_ >> 0x10) - fVar189) * fVar274 + fVar189) - fVar324) * fVar160;
  auVar208._12_4_ =
       ((((float)(auVar206._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar325) * fVar203;
  auVar247._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar140) * fVar274 + fVar140) - fVar255) *
                fVar102,((((float)(int)(short)uVar5 - (float)(int)(short)uVar59) * fVar274 +
                         (float)(int)(short)uVar59) - fVar241) * fVar70);
  auVar247._8_4_ =
       ((((float)(auVar244._8_4_ >> 0x10) - fVar190) * fVar274 + fVar190) - fVar258) * fVar163;
  auVar247._12_4_ =
       ((((float)(auVar245._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar318) * fVar212;
  auVar269._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar62) * fVar274 +
        (float)(int)(short)uVar62) - fVar241) * fVar70;
  auVar269._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar142) * fVar274 + fVar142) - fVar255) * fVar102;
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - fVar191) * fVar274 + fVar191) - fVar258) * fVar163;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar318) * fVar212;
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar289._0_8_ =
       CONCAT44(((((float)(auVar48._0_4_ >> 0x10) - fVar158) * fVar274 + fVar158) - fVar225) *
                fVar121,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar274 +
                         (float)(int)(short)uVar7) - fVar214) * fVar100);
  auVar289._8_4_ =
       ((((float)(auVar286._8_4_ >> 0x10) - fVar201) * fVar274 + fVar201) - fVar230) * fVar164;
  auVar289._12_4_ =
       ((((float)(auVar287._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar263) * fVar213;
  auVar308._0_4_ =
       ((((float)(int)(short)uVar52 - (float)(int)(short)uVar9) * fVar274 + (float)(int)(short)uVar9
        ) - fVar214) * fVar100;
  auVar308._4_4_ =
       ((((float)(auVar50._0_4_ >> 0x10) - fVar159) * fVar274 + fVar159) - fVar225) * fVar121;
  auVar308._8_4_ =
       ((((float)(auVar305._8_4_ >> 0x10) - fVar202) * fVar274 + fVar202) - fVar230) * fVar164;
  auVar308._12_4_ =
       ((((float)(auVar306._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar263) * fVar213;
  auVar124._8_4_ = auVar147._8_4_;
  auVar124._0_8_ = auVar147._0_8_;
  auVar124._12_4_ = auVar147._12_4_;
  auVar125 = minps(auVar124,auVar208);
  auVar112._8_4_ = auVar247._8_4_;
  auVar112._0_8_ = auVar247._0_8_;
  auVar112._12_4_ = auVar247._12_4_;
  auVar71 = minps(auVar112,auVar269);
  auVar125 = maxps(auVar125,auVar71);
  auVar113._8_4_ = auVar289._8_4_;
  auVar113._0_8_ = auVar289._0_8_;
  auVar113._12_4_ = auVar289._12_4_;
  auVar71 = minps(auVar113,auVar308);
  auVar88._4_4_ = uVar11;
  auVar88._0_4_ = uVar11;
  auVar88._8_4_ = uVar11;
  auVar88._12_4_ = uVar11;
  auVar71 = maxps(auVar71,auVar88);
  auVar71 = maxps(auVar125,auVar71);
  auVar125 = maxps(auVar147,auVar208);
  auVar248 = maxps(auVar247,auVar269);
  auVar125 = minps(auVar125,auVar248);
  auVar248 = maxps(auVar289,auVar308);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar89._4_4_ = uVar11;
  auVar89._0_4_ = uVar11;
  auVar89._8_4_ = uVar11;
  auVar89._12_4_ = uVar11;
  auVar248 = minps(auVar248,auVar89);
  local_298 = auVar71._0_4_ * 0.99999964;
  fStack_294 = auVar71._4_4_ * 0.99999964;
  fStack_290 = auVar71._8_4_ * 0.99999964;
  fStack_28c = auVar71._12_4_ * 0.99999964;
  auVar71 = minps(auVar125,auVar248);
  uVar64 = (uint)(byte)PVar10;
  auVar90._0_4_ = -(uint)(local_298 <= auVar71._0_4_ * 1.0000004 && uVar64 != 0);
  auVar90._4_4_ = -(uint)(fStack_294 <= auVar71._4_4_ * 1.0000004 && 1 < uVar64);
  auVar90._8_4_ = -(uint)(fStack_290 <= auVar71._8_4_ * 1.0000004 && 2 < uVar64);
  auVar90._12_4_ = -(uint)(fStack_28c <= auVar71._12_4_ * 1.0000004 && 3 < uVar64);
  uVar64 = movmskps(uVar64,auVar90);
  local_54d = uVar64 != 0;
  if (uVar64 == 0) {
    return local_54d;
  }
  uVar64 = uVar64 & 0xff;
  local_278._0_12_ = mm_lookupmask_ps._240_12_;
  local_278._12_4_ = 0;
  local_400 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3f8 = prim;
LAB_00c17fed:
  lVar18 = 0;
  if ((ulong)uVar64 != 0) {
    for (; (uVar64 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
    }
  }
  uVar65 = *(uint *)(local_3f8 + 2);
  uVar67 = *(uint *)(local_3f8 + lVar18 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar65].ptr;
  fVar141 = pGVar12->fnumTimeSegments;
  fVar70 = (pGVar12->time_range).lower;
  fVar100 = ((*(float *)(ray + k * 4 + 0x70) - fVar70) / ((pGVar12->time_range).upper - fVar70)) *
            fVar141;
  fVar70 = floorf(fVar100);
  fVar141 = fVar141 + -1.0;
  if (fVar141 <= fVar70) {
    fVar70 = fVar141;
  }
  fVar141 = 0.0;
  if (0.0 <= fVar70) {
    fVar141 = fVar70;
  }
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)uVar67 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)fVar141 * 0x38;
  lVar18 = *(long *)(_Var13 + 0x10 + lVar61);
  pfVar1 = (float *)(*(long *)(_Var13 + lVar61) + lVar18 * uVar53);
  fVar70 = *pfVar1;
  fVar101 = pfVar1[1];
  fVar102 = pfVar1[2];
  fVar121 = pfVar1[3];
  uVar60 = uVar53 + 1;
  pfVar1 = (float *)(*(long *)(_Var13 + lVar61) + lVar18 * uVar60);
  fVar122 = *pfVar1;
  fVar123 = pfVar1[1];
  fVar140 = pfVar1[2];
  fVar142 = pfVar1[3];
  p_Var56 = pGVar12[4].occlusionFilterN;
  lVar18 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar14 = *(long *)(lVar18 + 0x10 + lVar61);
  pfVar1 = (float *)(*(long *)(lVar18 + lVar61) + lVar14 * uVar53);
  fVar158 = *pfVar1;
  fVar159 = pfVar1[1];
  fVar160 = pfVar1[2];
  fVar163 = pfVar1[3];
  pfVar1 = (float *)(*(long *)(lVar18 + lVar61) + lVar14 * uVar60);
  fVar164 = *pfVar1;
  fVar165 = pfVar1[1];
  fVar189 = pfVar1[2];
  fVar190 = pfVar1[3];
  _Var15 = pGVar12[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar14 = *(long *)(_Var15 + 0x10 + lVar61);
  pfVar1 = (float *)(*(long *)(_Var15 + lVar61) + lVar14 * uVar53);
  pfVar2 = (float *)(*(long *)(_Var15 + lVar61) + lVar14 * uVar60);
  pfVar3 = (float *)(*(long *)(p_Var56 + lVar61) + *(long *)(p_Var56 + lVar61 + 0x10) * uVar53);
  fVar100 = fVar100 - fVar141;
  fVar141 = *pfVar3 * 0.33333334 + fVar70;
  fVar191 = pfVar3[1] * 0.33333334 + fVar101;
  fVar201 = pfVar3[2] * 0.33333334 + fVar102;
  fVar202 = pfVar3[3] * 0.33333334 + fVar121;
  pfVar3 = (float *)(*(long *)(p_Var56 + lVar61) + *(long *)(p_Var56 + lVar61 + 0x10) * uVar60);
  fVar214 = fVar122 - *pfVar3 * 0.33333334;
  fVar274 = fVar123 - pfVar3[1] * 0.33333334;
  fVar293 = fVar140 - pfVar3[2] * 0.33333334;
  fVar299 = fVar142 - pfVar3[3] * 0.33333334;
  fVar241 = *pfVar1 * 0.33333334 + fVar158;
  fVar277 = pfVar1[1] * 0.33333334 + fVar159;
  fVar316 = pfVar1[2] * 0.33333334 + fVar160;
  fVar319 = pfVar1[3] * 0.33333334 + fVar163;
  fVar323 = fVar164 - *pfVar2 * 0.33333334;
  fVar325 = fVar165 - pfVar2[1] * 0.33333334;
  fVar231 = fVar189 - pfVar2[2] * 0.33333334;
  fVar236 = fVar190 - pfVar2[3] * 0.33333334;
  fVar203 = fVar214 * 0.0;
  fVar212 = fVar274 * 0.0;
  fVar213 = fVar293 * 0.0;
  fVar258 = fVar299 * 0.0;
  fVar255 = fVar122 * 0.0 + fVar203;
  fVar318 = fVar123 * 0.0 + fVar212;
  fVar225 = fVar140 * 0.0 + fVar213;
  fVar263 = fVar142 * 0.0 + fVar258;
  fVar264 = fVar141 * 0.0;
  fVar275 = fVar191 * 0.0;
  fVar278 = fVar201 * 0.0;
  fVar280 = fVar202 * 0.0;
  fVar230 = fVar264 + fVar255 + fVar70;
  fVar282 = fVar275 + fVar318 + fVar101;
  fVar296 = fVar278 + fVar225 + fVar102;
  fVar302 = fVar280 + fVar263 + fVar121;
  fVar255 = (fVar141 * 3.0 + fVar255) - fVar70 * 3.0;
  fVar318 = (fVar191 * 3.0 + fVar318) - fVar101 * 3.0;
  fVar225 = (fVar201 * 3.0 + fVar225) - fVar102 * 3.0;
  fVar263 = (fVar202 * 3.0 + fVar263) - fVar121 * 3.0;
  fVar265 = fVar323 * 0.0;
  fVar276 = fVar325 * 0.0;
  fVar279 = fVar231 * 0.0;
  fVar281 = fVar236 * 0.0;
  fVar141 = fVar164 * 0.0 + fVar265;
  fVar191 = fVar165 * 0.0 + fVar276;
  fVar201 = fVar189 * 0.0 + fVar279;
  fVar202 = fVar190 * 0.0 + fVar281;
  fVar283 = fVar241 * 0.0;
  fVar294 = fVar277 * 0.0;
  fVar297 = fVar316 * 0.0;
  fVar300 = fVar319 * 0.0;
  fVar324 = fVar283 + fVar141 + fVar158;
  fVar226 = fVar294 + fVar191 + fVar159;
  fVar232 = fVar297 + fVar201 + fVar160;
  fVar237 = fVar300 + fVar202 + fVar163;
  fVar312 = (fVar241 * 3.0 + fVar141) - fVar158 * 3.0;
  fVar314 = (fVar277 * 3.0 + fVar191) - fVar159 * 3.0;
  fVar316 = (fVar316 * 3.0 + fVar201) - fVar160 * 3.0;
  fVar319 = (fVar319 * 3.0 + fVar202) - fVar163 * 3.0;
  fVar202 = fVar203 + fVar122 + fVar264 + fVar70 * 0.0;
  fVar212 = fVar212 + fVar123 + fVar275 + fVar101 * 0.0;
  fVar241 = fVar213 + fVar140 + fVar278 + fVar102 * 0.0;
  fVar277 = fVar258 + fVar142 + fVar280 + fVar121 * 0.0;
  fVar191 = ((fVar122 * 3.0 - fVar214 * 3.0) + fVar264) - fVar70 * 0.0;
  fVar201 = ((fVar123 * 3.0 - fVar274 * 3.0) + fVar275) - fVar101 * 0.0;
  fVar203 = ((fVar140 * 3.0 - fVar293 * 3.0) + fVar278) - fVar102 * 0.0;
  fVar213 = ((fVar142 * 3.0 - fVar299 * 3.0) + fVar280) - fVar121 * 0.0;
  fVar102 = fVar265 + fVar164 + fVar283 + fVar158 * 0.0;
  fVar121 = fVar276 + fVar165 + fVar294 + fVar159 * 0.0;
  fVar122 = fVar279 + fVar189 + fVar297 + fVar160 * 0.0;
  fVar123 = fVar281 + fVar190 + fVar300 + fVar163 * 0.0;
  fVar141 = ((fVar164 * 3.0 - fVar323 * 3.0) + fVar283) - fVar158 * 0.0;
  fVar70 = ((fVar165 * 3.0 - fVar325 * 3.0) + fVar294) - fVar159 * 0.0;
  fVar101 = ((fVar189 * 3.0 - fVar231 * 3.0) + fVar297) - fVar160 * 0.0;
  fVar164 = ((fVar190 * 3.0 - fVar236 * 3.0) + fVar300) - fVar163 * 0.0;
  fVar231 = fVar318 * fVar324 - fVar226 * fVar255;
  fVar236 = fVar225 * fVar226 - fVar232 * fVar318;
  fVar232 = fVar255 * fVar232 - fVar324 * fVar225;
  fVar237 = fVar263 * fVar237 - fVar237 * fVar263;
  fVar214 = fVar318 * fVar312 - fVar314 * fVar255;
  fVar324 = fVar225 * fVar314 - fVar316 * fVar318;
  fVar316 = fVar255 * fVar316 - fVar312 * fVar225;
  fVar299 = fVar201 * fVar102 - fVar121 * fVar191;
  fVar312 = fVar203 * fVar121 - fVar122 * fVar201;
  fVar314 = fVar191 * fVar122 - fVar102 * fVar203;
  fVar323 = fVar213 * fVar123 - fVar123 * fVar213;
  fVar189 = fVar201 * fVar141 - fVar70 * fVar191;
  fVar190 = fVar203 * fVar70 - fVar101 * fVar201;
  fVar293 = fVar191 * fVar101 - fVar141 * fVar203;
  fVar163 = fVar232 * fVar232 + fVar236 * fVar236 + fVar231 * fVar231;
  auVar71 = ZEXT416((uint)fVar163);
  auVar125 = rsqrtss(ZEXT416((uint)fVar163),auVar71);
  fVar141 = auVar125._0_4_;
  fVar325 = fVar141 * 1.5 - fVar141 * fVar141 * fVar163 * 0.5 * fVar141;
  fVar264 = fVar231 * fVar214 + fVar232 * fVar316 + fVar236 * fVar324;
  fVar258 = fVar237 * fVar325;
  auVar71 = rcpss(auVar71,auVar71);
  fVar274 = (2.0 - fVar163 * auVar71._0_4_) * auVar71._0_4_;
  fVar226 = fVar314 * fVar314 + fVar312 * fVar312 + fVar299 * fVar299;
  auVar125 = ZEXT416((uint)fVar226);
  auVar71 = rsqrtss(ZEXT416((uint)fVar226),auVar125);
  fVar141 = auVar71._0_4_;
  fVar265 = fVar141 * 1.5 - fVar141 * fVar141 * fVar226 * 0.5 * fVar141;
  fVar275 = fVar299 * fVar189 + fVar314 * fVar293 + fVar312 * fVar190;
  lVar14 = *(long *)(_Var13 + 0x38 + lVar61);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar61);
  pfVar1 = (float *)(lVar14 + lVar16 * uVar53);
  fVar141 = *pfVar1;
  fVar70 = pfVar1[1];
  fVar101 = pfVar1[2];
  fVar102 = pfVar1[3];
  pfVar1 = (float *)(lVar14 + lVar16 * uVar60);
  fVar121 = *pfVar1;
  fVar122 = pfVar1[1];
  fVar123 = pfVar1[2];
  fVar140 = pfVar1[3];
  lVar14 = *(long *)(lVar18 + 0x38 + lVar61);
  lVar18 = *(long *)(lVar18 + 0x48 + lVar61);
  pfVar1 = (float *)(lVar14 + lVar18 * uVar60);
  fVar142 = *pfVar1;
  fVar158 = pfVar1[1];
  fVar159 = pfVar1[2];
  fVar160 = pfVar1[3];
  lVar16 = *(long *)(_Var15 + 0x38 + lVar61);
  lVar17 = *(long *)(_Var15 + 0x48 + lVar61);
  auVar71 = rcpss(auVar125,auVar125);
  pfVar1 = (float *)(lVar16 + lVar17 * uVar60);
  fVar165 = fVar323 * fVar265;
  fVar276 = (2.0 - fVar226 * auVar71._0_4_) * auVar71._0_4_;
  fVar331 = fVar302 * fVar236 * fVar325;
  fVar337 = fVar302 * fVar232 * fVar325;
  fVar338 = fVar302 * fVar231 * fVar325;
  fVar339 = fVar302 * fVar258;
  fVar297 = fVar230 - fVar331;
  fVar227 = fVar282 - fVar337;
  fVar233 = fVar296 - fVar338;
  fVar238 = fVar302 - fVar339;
  fVar303 = fVar302 * fVar274 * (fVar163 * fVar324 - fVar264 * fVar236) * fVar325 +
            fVar263 * fVar236 * fVar325;
  fVar313 = fVar302 * fVar274 * (fVar163 * fVar316 - fVar264 * fVar232) * fVar325 +
            fVar263 * fVar232 * fVar325;
  fVar315 = fVar302 * fVar274 * (fVar163 * fVar214 - fVar264 * fVar231) * fVar325 +
            fVar263 * fVar231 * fVar325;
  fVar317 = fVar302 * fVar274 * (fVar163 * (fVar263 * fVar319 - fVar319 * fVar263) -
                                fVar264 * fVar237) * fVar325 + fVar263 * fVar258;
  fVar331 = fVar331 + fVar230;
  fVar337 = fVar337 + fVar282;
  fVar338 = fVar338 + fVar296;
  fVar339 = fVar339 + fVar302;
  fVar258 = fVar277 * fVar312 * fVar265;
  fVar214 = fVar277 * fVar314 * fVar265;
  fVar230 = fVar277 * fVar299 * fVar265;
  fVar274 = fVar277 * fVar165;
  pfVar2 = (float *)(*(long *)(p_Var56 + lVar61 + 0x38) +
                    *(long *)(p_Var56 + lVar61 + 0x48) * uVar60);
  fVar242 = fVar202 - fVar258;
  fVar256 = fVar212 - fVar214;
  fVar259 = fVar241 - fVar230;
  fVar261 = fVar277 - fVar274;
  fVar316 = fVar277 * fVar276 * (fVar226 * fVar190 - fVar275 * fVar312) * fVar265 +
            fVar213 * fVar312 * fVar265;
  fVar324 = fVar277 * fVar276 * (fVar226 * fVar293 - fVar275 * fVar314) * fVar265 +
            fVar213 * fVar314 * fVar265;
  fVar231 = fVar277 * fVar276 * (fVar226 * fVar189 - fVar275 * fVar299) * fVar265 +
            fVar213 * fVar299 * fVar265;
  fVar237 = fVar277 * fVar276 * (fVar226 * (fVar213 * fVar164 - fVar164 * fVar213) -
                                fVar275 * fVar323) * fVar265 + fVar213 * fVar165;
  fVar258 = fVar258 + fVar202;
  fVar214 = fVar214 + fVar212;
  fVar230 = fVar230 + fVar241;
  fVar274 = fVar274 + fVar277;
  fVar277 = fVar121 - *pfVar2 * 0.33333334;
  fVar293 = fVar122 - pfVar2[1] * 0.33333334;
  fVar299 = fVar123 - pfVar2[2] * 0.33333334;
  fVar312 = fVar140 - pfVar2[3] * 0.33333334;
  fVar275 = fVar142 - *pfVar1 * 0.33333334;
  fVar278 = fVar158 - pfVar1[1] * 0.33333334;
  fVar280 = fVar159 - pfVar1[2] * 0.33333334;
  fVar283 = fVar160 - pfVar1[3] * 0.33333334;
  fVar190 = fVar277 * 0.0;
  fVar202 = fVar293 * 0.0;
  fVar212 = fVar299 * 0.0;
  fVar241 = fVar312 * 0.0;
  fVar300 = fVar121 * 0.0 + fVar190;
  fVar228 = fVar122 * 0.0 + fVar202;
  fVar234 = fVar123 * 0.0 + fVar212;
  fVar239 = fVar140 * 0.0 + fVar241;
  pfVar1 = (float *)(*(long *)(p_Var56 + lVar61 + 0x38) +
                    *(long *)(p_Var56 + lVar61 + 0x48) * uVar53);
  fVar163 = *pfVar1 * 0.33333334 + fVar141;
  fVar164 = pfVar1[1] * 0.33333334 + fVar70;
  fVar165 = pfVar1[2] * 0.33333334 + fVar101;
  fVar189 = pfVar1[3] * 0.33333334 + fVar102;
  fVar319 = fVar163 * 0.0;
  fVar325 = fVar164 * 0.0;
  fVar232 = fVar165 * 0.0;
  fVar264 = fVar189 * 0.0;
  fVar282 = (fVar163 * 3.0 + fVar300) - fVar141 * 3.0;
  fVar296 = (fVar164 * 3.0 + fVar228) - fVar70 * 3.0;
  fVar302 = (fVar165 * 3.0 + fVar234) - fVar101 * 3.0;
  fVar314 = (fVar189 * 3.0 + fVar239) - fVar102 * 3.0;
  fVar243 = fVar275 * 0.0;
  fVar257 = fVar278 * 0.0;
  fVar260 = fVar280 * 0.0;
  fVar262 = fVar283 * 0.0;
  fVar215 = fVar142 * 0.0 + fVar243;
  fVar229 = fVar158 * 0.0 + fVar257;
  fVar235 = fVar159 * 0.0 + fVar260;
  fVar240 = fVar160 * 0.0 + fVar262;
  pfVar1 = (float *)(lVar16 + uVar53 * lVar17);
  pfVar2 = (float *)(lVar14 + lVar18 * uVar53);
  fVar163 = *pfVar2;
  fVar164 = pfVar2[1];
  fVar165 = pfVar2[2];
  fVar189 = pfVar2[3];
  fVar323 = *pfVar1 * 0.33333334 + fVar163;
  fVar226 = pfVar1[1] * 0.33333334 + fVar164;
  fVar236 = pfVar1[2] * 0.33333334 + fVar165;
  fVar265 = pfVar1[3] * 0.33333334 + fVar189;
  fVar284 = fVar323 * 0.0;
  fVar295 = fVar226 * 0.0;
  fVar298 = fVar236 * 0.0;
  fVar301 = fVar265 * 0.0;
  fVar276 = (fVar323 * 3.0 + fVar215) - fVar163 * 3.0;
  fVar279 = (fVar226 * 3.0 + fVar229) - fVar164 * 3.0;
  fVar281 = (fVar236 * 3.0 + fVar235) - fVar165 * 3.0;
  fVar294 = (fVar265 * 3.0 + fVar240) - fVar189 * 3.0;
  fVar323 = fVar319 + fVar300 + fVar141;
  fVar226 = fVar325 + fVar228 + fVar70;
  fVar236 = fVar232 + fVar234 + fVar101;
  fVar265 = fVar264 + fVar239 + fVar102;
  fVar190 = fVar190 + fVar121 + fVar319 + fVar141 * 0.0;
  fVar202 = fVar202 + fVar122 + fVar325 + fVar70 * 0.0;
  fVar212 = fVar212 + fVar123 + fVar232 + fVar101 * 0.0;
  fVar241 = fVar241 + fVar140 + fVar264 + fVar102 * 0.0;
  fVar141 = ((fVar121 * 3.0 - fVar277 * 3.0) + fVar319) - fVar141 * 0.0;
  fVar70 = ((fVar122 * 3.0 - fVar293 * 3.0) + fVar325) - fVar70 * 0.0;
  fVar101 = ((fVar123 * 3.0 - fVar299 * 3.0) + fVar232) - fVar101 * 0.0;
  fVar102 = ((fVar140 * 3.0 - fVar312 * 3.0) + fVar264) - fVar102 * 0.0;
  fVar299 = fVar284 + fVar215 + fVar163;
  fVar312 = fVar295 + fVar229 + fVar164;
  fVar319 = fVar298 + fVar235 + fVar165;
  fVar232 = fVar301 + fVar240 + fVar189;
  fVar122 = fVar243 + fVar142 + fVar284 + fVar163 * 0.0;
  fVar140 = fVar257 + fVar158 + fVar295 + fVar164 * 0.0;
  fVar277 = fVar260 + fVar159 + fVar298 + fVar165 * 0.0;
  fVar293 = fVar262 + fVar160 + fVar301 + fVar189 * 0.0;
  fVar121 = ((fVar142 * 3.0 - fVar275 * 3.0) + fVar284) - fVar163 * 0.0;
  fVar123 = ((fVar158 * 3.0 - fVar278 * 3.0) + fVar295) - fVar164 * 0.0;
  fVar142 = ((fVar159 * 3.0 - fVar280 * 3.0) + fVar298) - fVar165 * 0.0;
  fVar160 = ((fVar160 * 3.0 - fVar283 * 3.0) + fVar301) - fVar189 * 0.0;
  fVar325 = fVar296 * fVar299 - fVar312 * fVar282;
  fVar264 = fVar302 * fVar312 - fVar319 * fVar296;
  fVar283 = fVar282 * fVar319 - fVar299 * fVar302;
  fVar300 = fVar314 * fVar232 - fVar232 * fVar314;
  fVar159 = fVar296 * fVar276 - fVar279 * fVar282;
  fVar164 = fVar302 * fVar279 - fVar281 * fVar296;
  fVar165 = fVar282 * fVar281 - fVar276 * fVar302;
  fVar319 = fVar70 * fVar122 - fVar140 * fVar141;
  fVar232 = fVar101 * fVar140 - fVar277 * fVar70;
  fVar275 = fVar141 * fVar277 - fVar122 * fVar101;
  fVar278 = fVar102 * fVar293 - fVar293 * fVar102;
  fVar122 = fVar70 * fVar121 - fVar123 * fVar141;
  fVar140 = fVar101 * fVar123 - fVar142 * fVar70;
  fVar158 = fVar141 * fVar142 - fVar121 * fVar101;
  fVar121 = fVar283 * fVar283 + fVar264 * fVar264 + fVar325 * fVar325;
  auVar71 = ZEXT416((uint)fVar121);
  auVar125 = rsqrtss(ZEXT416((uint)fVar121),auVar71);
  fVar123 = auVar125._0_4_;
  fVar276 = fVar123 * 1.5 - fVar123 * fVar123 * fVar121 * 0.5 * fVar123;
  fVar279 = fVar325 * fVar159 + fVar283 * fVar165 + fVar264 * fVar164;
  auVar71 = rcpss(auVar71,auVar71);
  fVar163 = (2.0 - fVar121 * auVar71._0_4_) * auVar71._0_4_;
  fVar189 = fVar300 * fVar276;
  fVar280 = fVar275 * fVar275 + fVar232 * fVar232 + fVar319 * fVar319;
  auVar71 = ZEXT416((uint)fVar280);
  auVar125 = rsqrtss(ZEXT416((uint)fVar280),auVar71);
  fVar123 = auVar125._0_4_;
  fVar215 = fVar123 * 1.5 - fVar123 * fVar123 * fVar280 * 0.5 * fVar123;
  fVar228 = fVar319 * fVar122 + fVar275 * fVar158 + fVar232 * fVar140;
  auVar71 = rcpss(auVar71,auVar71);
  fVar229 = (2.0 - fVar280 * auVar71._0_4_) * auVar71._0_4_;
  fVar281 = fVar278 * fVar215;
  fVar277 = fVar265 * fVar264 * fVar276;
  fVar293 = fVar265 * fVar283 * fVar276;
  fVar299 = fVar265 * fVar325 * fVar276;
  fVar312 = fVar265 * fVar189;
  fVar123 = fVar265 * fVar163 * (fVar121 * fVar164 - fVar279 * fVar264) * fVar276 +
            fVar314 * fVar264 * fVar276;
  fVar142 = fVar265 * fVar163 * (fVar121 * fVar165 - fVar279 * fVar283) * fVar276 +
            fVar314 * fVar283 * fVar276;
  fVar159 = fVar265 * fVar163 * (fVar121 * fVar159 - fVar279 * fVar325) * fVar276 +
            fVar314 * fVar325 * fVar276;
  fVar163 = fVar265 * fVar163 * (fVar121 * (fVar314 * fVar294 - fVar294 * fVar314) -
                                fVar279 * fVar300) * fVar276 + fVar314 * fVar189;
  fVar325 = fVar323 - fVar277;
  fVar264 = fVar226 - fVar293;
  fVar276 = fVar236 - fVar299;
  fVar279 = fVar265 - fVar312;
  fVar277 = fVar277 + fVar323;
  fVar293 = fVar293 + fVar226;
  fVar299 = fVar299 + fVar236;
  fVar312 = fVar312 + fVar265;
  fVar121 = fVar241 * fVar232 * fVar215;
  fVar164 = fVar241 * fVar275 * fVar215;
  fVar165 = fVar241 * fVar319 * fVar215;
  fVar189 = fVar241 * fVar281;
  fVar323 = fVar241 * fVar229 * (fVar280 * fVar140 - fVar228 * fVar232) * fVar215 +
            fVar102 * fVar232 * fVar215;
  fVar226 = fVar241 * fVar229 * (fVar280 * fVar158 - fVar228 * fVar275) * fVar215 +
            fVar102 * fVar275 * fVar215;
  fVar232 = fVar241 * fVar229 * (fVar280 * fVar122 - fVar228 * fVar319) * fVar215 +
            fVar102 * fVar319 * fVar215;
  fVar236 = fVar241 * fVar229 * (fVar280 * (fVar102 * fVar160 - fVar160 * fVar102) -
                                fVar228 * fVar278) * fVar215 + fVar102 * fVar281;
  fVar122 = fVar190 - fVar121;
  fVar140 = fVar202 - fVar164;
  fVar158 = fVar212 - fVar165;
  fVar160 = fVar241 - fVar189;
  fVar121 = fVar121 + fVar190;
  fVar164 = fVar164 + fVar202;
  fVar165 = fVar165 + fVar212;
  fVar189 = fVar189 + fVar241;
  fVar319 = 1.0 - fVar100;
  fVar265 = fVar297 * fVar319 + fVar325 * fVar100;
  fVar275 = fVar227 * fVar319 + fVar264 * fVar100;
  fVar278 = fVar233 * fVar319 + fVar276 * fVar100;
  fVar280 = fVar238 * fVar319 + fVar279 * fVar100;
  fVar325 = ((fVar255 - fVar303) * 0.33333334 + fVar297) * fVar319 +
            ((fVar282 - fVar123) * 0.33333334 + fVar325) * fVar100;
  fVar264 = ((fVar318 - fVar313) * 0.33333334 + fVar227) * fVar319 +
            ((fVar296 - fVar142) * 0.33333334 + fVar264) * fVar100;
  fVar276 = ((fVar225 - fVar315) * 0.33333334 + fVar233) * fVar319 +
            ((fVar302 - fVar159) * 0.33333334 + fVar276) * fVar100;
  fVar279 = ((fVar263 - fVar317) * 0.33333334 + fVar238) * fVar319 +
            ((fVar314 - fVar163) * 0.33333334 + fVar279) * fVar100;
  fVar190 = (fVar242 - (fVar191 - fVar316) * 0.33333334) * fVar319 +
            (fVar122 - (fVar141 - fVar323) * 0.33333334) * fVar100;
  fVar202 = (fVar256 - (fVar201 - fVar324) * 0.33333334) * fVar319 +
            (fVar140 - (fVar70 - fVar226) * 0.33333334) * fVar100;
  fVar212 = (fVar259 - (fVar203 - fVar231) * 0.33333334) * fVar319 +
            (fVar158 - (fVar101 - fVar232) * 0.33333334) * fVar100;
  fVar241 = (fVar261 - (fVar213 - fVar237) * 0.33333334) * fVar319 +
            (fVar160 - (fVar102 - fVar236) * 0.33333334) * fVar100;
  fVar122 = fVar242 * fVar319 + fVar122 * fVar100;
  fVar140 = fVar256 * fVar319 + fVar140 * fVar100;
  fVar158 = fVar259 * fVar319 + fVar158 * fVar100;
  fVar160 = fVar261 * fVar319 + fVar160 * fVar100;
  fVar281 = fVar331 * fVar319 + fVar277 * fVar100;
  fVar283 = fVar337 * fVar319 + fVar293 * fVar100;
  fVar294 = fVar338 * fVar319 + fVar299 * fVar100;
  fVar297 = fVar339 * fVar319 + fVar312 * fVar100;
  fVar255 = ((fVar303 + fVar255) * 0.33333334 + fVar331) * fVar319 +
            ((fVar123 + fVar282) * 0.33333334 + fVar277) * fVar100;
  fVar318 = ((fVar313 + fVar318) * 0.33333334 + fVar337) * fVar319 +
            ((fVar142 + fVar296) * 0.33333334 + fVar293) * fVar100;
  fVar225 = ((fVar315 + fVar225) * 0.33333334 + fVar338) * fVar319 +
            ((fVar159 + fVar302) * 0.33333334 + fVar299) * fVar100;
  fVar263 = ((fVar317 + fVar263) * 0.33333334 + fVar339) * fVar319 +
            ((fVar163 + fVar314) * 0.33333334 + fVar312) * fVar100;
  fVar123 = (fVar258 - (fVar316 + fVar191) * 0.33333334) * fVar319 +
            (fVar121 - (fVar323 + fVar141) * 0.33333334) * fVar100;
  fVar142 = (fVar214 - (fVar324 + fVar201) * 0.33333334) * fVar319 +
            (fVar164 - (fVar226 + fVar70) * 0.33333334) * fVar100;
  fVar159 = (fVar230 - (fVar231 + fVar203) * 0.33333334) * fVar319 +
            (fVar165 - (fVar232 + fVar101) * 0.33333334) * fVar100;
  fVar163 = (fVar274 - (fVar237 + fVar213) * 0.33333334) * fVar319 +
            (fVar189 - (fVar236 + fVar102) * 0.33333334) * fVar100;
  local_288 = fVar319 * fVar258 + fVar100 * fVar121;
  fStack_284 = fVar319 * fVar214 + fVar100 * fVar164;
  fStack_280 = fVar319 * fVar230 + fVar100 * fVar165;
  fStack_27c = fVar319 * fVar274 + fVar100 * fVar189;
  local_1c8 = *(float *)(ray + k * 4);
  fStack_1c4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1c0 = *(float *)(ray + k * 4 + 0x20);
  local_158 = fVar265 - local_1c8;
  fStack_154 = fVar275 - fStack_1c4;
  fStack_150 = fVar278 - fStack_1c0;
  fStack_14c = fVar280 - 0.0;
  fVar141 = pre->ray_space[k].vx.field_0.m128[0];
  fVar70 = pre->ray_space[k].vx.field_0.m128[1];
  fVar100 = pre->ray_space[k].vy.field_0.m128[0];
  fVar101 = pre->ray_space[k].vy.field_0.m128[1];
  fVar102 = pre->ray_space[k].vz.field_0.m128[0];
  fVar121 = pre->ray_space[k].vz.field_0.m128[1];
  fVar282 = local_158 * fVar141 + fStack_154 * fVar100 + fStack_150 * fVar102;
  fVar293 = local_158 * fVar70 + fStack_154 * fVar101 + fStack_150 * fVar121;
  local_348 = CONCAT44(fVar293,fVar282);
  local_168 = fVar325 - local_1c8;
  fStack_164 = fVar264 - fStack_1c4;
  fStack_160 = fVar276 - fStack_1c0;
  fStack_15c = fVar279 - 0.0;
  fVar274 = local_168 * fVar141 + fStack_164 * fVar100 + fStack_160 * fVar102;
  fVar277 = local_168 * fVar70 + fStack_164 * fVar101 + fStack_160 * fVar121;
  local_358 = CONCAT44(fVar277,fVar274);
  local_178 = fVar190 - local_1c8;
  fStack_174 = fVar202 - fStack_1c4;
  fStack_170 = fVar212 - fStack_1c0;
  fStack_16c = fVar241 - 0.0;
  fVar189 = local_178 * fVar141 + fStack_174 * fVar100 + fStack_170 * fVar102;
  fVar191 = local_178 * fVar70 + fStack_174 * fVar101 + fStack_170 * fVar121;
  local_368 = CONCAT44(fVar191,fVar189);
  local_188 = fVar122 - local_1c8;
  fStack_184 = fVar140 - fStack_1c4;
  fStack_180 = fVar158 - fStack_1c0;
  fStack_17c = fVar160 - 0.0;
  fVar164 = local_188 * fVar141 + fStack_184 * fVar100 + fStack_180 * fVar102;
  fVar165 = local_188 * fVar70 + fStack_184 * fVar101 + fStack_180 * fVar121;
  local_378 = CONCAT44(fVar165,fVar164);
  local_198 = fVar281 - local_1c8;
  fStack_194 = fVar283 - fStack_1c4;
  fStack_190 = fVar294 - fStack_1c0;
  fStack_18c = fVar297 - 0.0;
  fVar201 = local_198 * fVar141 + fStack_194 * fVar100 + fStack_190 * fVar102;
  fVar203 = local_198 * fVar70 + fStack_194 * fVar101 + fStack_190 * fVar121;
  local_388 = CONCAT44(fVar203,fVar201);
  local_1a8 = fVar255 - local_1c8;
  fStack_1a4 = fVar318 - fStack_1c4;
  fStack_1a0 = fVar225 - fStack_1c0;
  fStack_19c = fVar263 - 0.0;
  fVar213 = local_1a8 * fVar141 + fStack_1a4 * fVar100 + fStack_1a0 * fVar102;
  fVar258 = local_1a8 * fVar70 + fStack_1a4 * fVar101 + fStack_1a0 * fVar121;
  local_398 = CONCAT44(fVar258,fVar213);
  local_1b8 = fVar123 - local_1c8;
  fStack_1b4 = fVar142 - fStack_1c4;
  fStack_1b0 = fVar159 - fStack_1c0;
  fStack_1ac = fVar163 - 0.0;
  fVar214 = local_1b8 * fVar141 + fStack_1b4 * fVar100 + fStack_1b0 * fVar102;
  fVar230 = local_1b8 * fVar70 + fStack_1b4 * fVar101 + fStack_1b0 * fVar121;
  local_3a8 = CONCAT44(fVar230,fVar214);
  local_1c8 = local_288 - local_1c8;
  fStack_1c4 = fStack_284 - fStack_1c4;
  fStack_1c0 = fStack_280 - fStack_1c0;
  fStack_1bc = fStack_27c - 0.0;
  fVar100 = local_1c8 * fVar141 + fStack_1c4 * fVar100 + fStack_1c0 * fVar102;
  fVar70 = local_1c8 * fVar70 + fStack_1c4 * fVar101 + fStack_1c0 * fVar121;
  local_3b8 = CONCAT44(fVar70,fVar100);
  auVar182._8_8_ = local_398;
  auVar182._0_8_ = local_358;
  register0x00001488 = local_3b8;
  local_148 = local_378;
  auVar91._8_4_ = fVar201;
  auVar91._0_8_ = local_348;
  auVar91._12_4_ = fVar203;
  auVar71 = minps(auVar91,auVar182);
  auVar114._8_4_ = fVar214;
  auVar114._0_8_ = local_368;
  auVar114._12_4_ = fVar230;
  auVar125 = minps(auVar114,_local_148);
  auVar71 = minps(auVar71,auVar125);
  auVar115._4_4_ = fVar293;
  auVar115._0_4_ = fVar282;
  auVar115._8_4_ = fVar201;
  auVar115._12_4_ = fVar203;
  auVar125 = maxps(auVar115,auVar182);
  auVar126._4_4_ = fVar191;
  auVar126._0_4_ = fVar189;
  auVar126._8_4_ = fVar214;
  auVar126._12_4_ = fVar230;
  auVar127 = maxps(auVar126,_local_148);
  auVar248 = maxps(auVar125,auVar127);
  auVar19._4_8_ = auVar127._8_8_;
  auVar19._0_4_ = auVar71._4_4_;
  auVar128._0_8_ = auVar19._0_8_ << 0x20;
  auVar128._8_4_ = auVar71._8_4_;
  auVar128._12_4_ = auVar71._12_4_;
  auVar129._8_8_ = auVar71._8_8_;
  auVar129._0_8_ = auVar128._8_8_;
  auVar125 = minps(auVar71,auVar129);
  auVar20._4_8_ = auVar71._8_8_;
  auVar20._0_4_ = auVar248._4_4_;
  auVar130._0_8_ = auVar20._0_8_ << 0x20;
  auVar130._8_4_ = auVar248._8_4_;
  auVar130._12_4_ = auVar248._12_4_;
  auVar131._8_8_ = auVar248._8_8_;
  auVar131._0_8_ = auVar130._8_8_;
  auVar71 = maxps(auVar248,auVar131);
  auVar92._0_8_ = auVar125._0_8_ & 0x7fffffff7fffffff;
  auVar92._8_4_ = auVar125._8_4_ & 0x7fffffff;
  auVar92._12_4_ = auVar125._12_4_ & 0x7fffffff;
  auVar116._0_8_ = auVar71._0_8_ & 0x7fffffff7fffffff;
  auVar116._8_4_ = auVar71._8_4_ & 0x7fffffff;
  auVar116._12_4_ = auVar71._12_4_ & 0x7fffffff;
  auVar71 = maxps(auVar92,auVar116);
  fVar141 = auVar71._4_4_;
  if (auVar71._4_4_ <= auVar71._0_4_) {
    fVar141 = auVar71._0_4_;
  }
  local_3f0 = (ulong)uVar64 + 0xf;
  fVar141 = fVar141 * 9.536743e-07;
  local_258 = fVar141;
  fStack_254 = fVar141;
  fStack_250 = fVar141;
  fStack_24c = fVar141;
  local_268 = -fVar141;
  fStack_264 = -fVar141;
  fStack_260 = -fVar141;
  fStack_25c = -fVar141;
  local_118 = fVar274 - fVar282;
  fStack_114 = fVar277 - fVar293;
  fStack_110 = fVar213 - fVar201;
  fStack_10c = fVar258 - fVar203;
  local_128 = fVar189 - fVar274;
  fStack_124 = fVar191 - fVar277;
  fStack_120 = fVar214 - fVar213;
  fStack_11c = fVar230 - fVar258;
  local_138 = fVar164 - fVar189;
  fStack_134 = fVar165 - fVar191;
  fStack_130 = fVar100 - fVar214;
  fStack_12c = fVar70 - fVar230;
  local_2a8 = fVar281 - fVar265;
  fStack_2a4 = fVar283 - fVar275;
  fStack_2a0 = fVar294 - fVar278;
  fStack_29c = fVar297 - fVar280;
  local_2b8 = fVar255 - fVar325;
  fStack_2b4 = fVar318 - fVar264;
  fStack_2b0 = fVar225 - fVar276;
  fStack_2ac = fVar263 - fVar279;
  local_2c8 = fVar123 - fVar190;
  fStack_2c4 = fVar142 - fVar202;
  fStack_2c0 = fVar159 - fVar212;
  fStack_2bc = fVar163 - fVar241;
  local_2d8 = local_288 - fVar122;
  fStack_2d4 = fStack_284 - fVar140;
  fStack_2d0 = fStack_280 - fVar158;
  fStack_2cc = fStack_27c - fVar160;
  local_2e8 = uVar65;
  uStack_2e4 = uVar65;
  uStack_2e0 = uVar65;
  uStack_2dc = uVar65;
  local_2f8 = uVar67;
  uStack_2f4 = uVar67;
  uStack_2f0 = uVar67;
  uStack_2ec = uVar67;
  local_54c = 0;
  uVar53 = 0;
  fVar70 = *(float *)(ray + k * 4 + 0x30);
  local_538 = 0x3f80000000000000;
  local_4c8 = 0x3f80000000000000;
  uStack_3b0 = local_3b8;
  uStack_3a0 = local_3a8;
  uStack_390 = local_398;
  uStack_380 = local_388;
  uStack_370 = local_378;
  uStack_360 = local_368;
  uStack_350 = local_358;
  uStack_340 = local_348;
  do {
    fVar100 = 1.0 - (float)local_538;
    fVar101 = 1.0 - (float)local_538;
    fVar102 = 1.0 - local_538._4_4_;
    fVar121 = 1.0 - local_538._4_4_;
    fVar160 = (float)local_348 * fVar100 + (float)local_388 * (float)local_538;
    fVar302 = local_348._4_4_ * fVar101 + local_388._4_4_ * (float)local_538;
    fVar314 = (float)uStack_340 * fVar102 + (float)uStack_380 * local_538._4_4_;
    fVar323 = uStack_340._4_4_ * fVar121 + uStack_380._4_4_ * local_538._4_4_;
    fVar263 = (float)local_358 * fVar100 + (float)local_398 * (float)local_538;
    fVar316 = local_358._4_4_ * fVar101 + local_398._4_4_ * (float)local_538;
    fVar236 = (float)uStack_350 * fVar102 + (float)uStack_390 * local_538._4_4_;
    fVar237 = uStack_350._4_4_ * fVar121 + uStack_390._4_4_ * local_538._4_4_;
    fVar231 = (float)local_368 * fVar100 + (float)local_3a8 * (float)local_538;
    fVar232 = local_368._4_4_ * fVar101 + local_3a8._4_4_ * (float)local_538;
    fVar279 = (float)uStack_360 * fVar102 + (float)uStack_3a0 * local_538._4_4_;
    fVar283 = uStack_360._4_4_ * fVar121 + uStack_3a0._4_4_ * local_538._4_4_;
    fVar280 = fVar100 * (float)local_378 + (float)local_538 * (float)local_3b8;
    fVar281 = fVar101 * local_378._4_4_ + (float)local_538 * local_3b8._4_4_;
    fVar235 = fVar102 * (float)uStack_370 + local_538._4_4_ * (float)uStack_3b0;
    fVar238 = fVar121 * uStack_370._4_4_ + local_538._4_4_ * uStack_3b0._4_4_;
    fVar100 = (local_4c8._4_4_ - (float)local_4c8) * 0.11111111;
    fVar297 = (local_4c8._4_4_ - (float)local_4c8) * 0.0 + (float)local_4c8;
    fVar300 = (local_4c8._4_4_ - (float)local_4c8) * 0.33333334 + (float)local_4c8;
    fVar215 = (local_4c8._4_4_ - (float)local_4c8) * 0.6666667 + (float)local_4c8;
    fVar227 = (local_4c8._4_4_ - (float)local_4c8) * 1.0 + (float)local_4c8;
    fVar228 = 1.0 - fVar297;
    fVar229 = 1.0 - fVar300;
    fVar233 = 1.0 - fVar215;
    fVar234 = 1.0 - fVar227;
    fVar163 = fVar263 * fVar228 + fVar231 * fVar297;
    fVar164 = fVar263 * fVar229 + fVar231 * fVar300;
    fVar165 = fVar263 * fVar233 + fVar231 * fVar215;
    fVar241 = fVar263 * fVar234 + fVar231 * fVar227;
    fVar312 = fVar316 * fVar228 + fVar232 * fVar297;
    fVar319 = fVar316 * fVar229 + fVar232 * fVar300;
    fVar324 = fVar316 * fVar233 + fVar232 * fVar215;
    fVar226 = fVar316 * fVar234 + fVar232 * fVar227;
    fVar101 = (fVar160 * fVar228 + fVar263 * fVar297) * fVar228 + fVar297 * fVar163;
    fVar102 = (fVar160 * fVar229 + fVar263 * fVar300) * fVar229 + fVar300 * fVar164;
    fVar121 = (fVar160 * fVar233 + fVar263 * fVar215) * fVar233 + fVar215 * fVar165;
    fVar160 = (fVar160 * fVar234 + fVar263 * fVar227) * fVar234 + fVar227 * fVar241;
    fVar263 = (fVar302 * fVar228 + fVar316 * fVar297) * fVar228 + fVar297 * fVar312;
    fVar296 = (fVar302 * fVar229 + fVar316 * fVar300) * fVar229 + fVar300 * fVar319;
    fVar299 = (fVar302 * fVar233 + fVar316 * fVar215) * fVar233 + fVar215 * fVar324;
    fVar302 = (fVar302 * fVar234 + fVar316 * fVar227) * fVar234 + fVar227 * fVar226;
    fVar163 = fVar163 * fVar228 + (fVar231 * fVar228 + fVar280 * fVar297) * fVar297;
    fVar164 = fVar164 * fVar229 + (fVar231 * fVar229 + fVar280 * fVar300) * fVar300;
    fVar165 = fVar165 * fVar233 + (fVar231 * fVar233 + fVar280 * fVar215) * fVar215;
    fVar241 = fVar241 * fVar234 + (fVar231 * fVar234 + fVar280 * fVar227) * fVar227;
    fVar316 = fVar312 * fVar228 + (fVar232 * fVar228 + fVar281 * fVar297) * fVar297;
    fVar312 = fVar319 * fVar229 + (fVar232 * fVar229 + fVar281 * fVar300) * fVar300;
    fVar319 = fVar324 * fVar233 + (fVar232 * fVar233 + fVar281 * fVar215) * fVar215;
    fVar324 = fVar226 * fVar234 + (fVar232 * fVar234 + fVar281 * fVar227) * fVar227;
    local_3e8 = fVar228 * fVar101 + fVar297 * fVar163;
    fStack_3e4 = fVar229 * fVar102 + fVar300 * fVar164;
    fStack_3e0 = fVar233 * fVar121 + fVar215 * fVar165;
    fStack_3dc = fVar234 * fVar160 + fVar227 * fVar241;
    local_3d8 = fVar228 * fVar263 + fVar297 * fVar316;
    fStack_3d4 = fVar229 * fVar296 + fVar300 * fVar312;
    fStack_3d0 = fVar233 * fVar299 + fVar215 * fVar319;
    fStack_3cc = fVar234 * fVar302 + fVar227 * fVar324;
    fVar164 = (fVar164 - fVar102) * 3.0 * fVar100;
    fVar121 = (fVar165 - fVar121) * 3.0 * fVar100;
    fVar160 = (fVar241 - fVar160) * 3.0 * fVar100;
    fVar241 = (fVar312 - fVar296) * 3.0 * fVar100;
    fVar319 = (fVar319 - fVar299) * 3.0 * fVar100;
    fVar302 = (fVar324 - fVar302) * 3.0 * fVar100;
    local_1f8._4_4_ = fStack_3e0;
    local_1f8._0_4_ = fStack_3e4;
    local_1d8._4_4_ = fStack_3d0;
    local_1d8._0_4_ = fStack_3d4;
    fVar165 = local_3e8 + (fVar163 - fVar101) * 3.0 * fVar100;
    fVar296 = fStack_3e4 + fVar164;
    fVar299 = fStack_3e0 + fVar121;
    fVar312 = fStack_3dc + fVar160;
    fVar101 = local_3d8 + (fVar316 - fVar263) * 3.0 * fVar100;
    fVar102 = fStack_3d4 + fVar241;
    fStack_540 = fStack_3d0 + fVar319;
    fStack_53c = fStack_3cc + fVar302;
    local_3c8._0_4_ = fStack_3e4 - fVar164;
    local_3c8._4_4_ = fStack_3e0 - fVar121;
    local_3c8._8_4_ = fStack_3dc - fVar160;
    local_3c8._12_4_ = 0;
    local_1d8._8_4_ = fStack_3cc;
    local_1d8._12_4_ = 0;
    local_1e8._0_4_ = fStack_3d4 - fVar241;
    local_1e8._4_4_ = fStack_3d0 - fVar319;
    local_1e8._8_4_ = fStack_3cc - fVar302;
    local_1e8._12_4_ = 0;
    fVar121 = fVar236 * fVar228 + fVar279 * fVar297;
    fVar160 = fVar236 * fVar229 + fVar279 * fVar300;
    fVar163 = fVar236 * fVar233 + fVar279 * fVar215;
    fVar164 = fVar236 * fVar234 + fVar279 * fVar227;
    fVar241 = fVar237 * fVar228 + fVar283 * fVar297;
    fVar263 = fVar237 * fVar229 + fVar283 * fVar300;
    fVar302 = fVar237 * fVar233 + fVar283 * fVar215;
    fVar281 = fVar237 * fVar234 + fVar283 * fVar227;
    fVar226 = (fVar314 * fVar228 + fVar236 * fVar297) * fVar228 + fVar297 * fVar121;
    fVar231 = (fVar314 * fVar229 + fVar236 * fVar300) * fVar229 + fVar300 * fVar160;
    fVar232 = (fVar314 * fVar233 + fVar236 * fVar215) * fVar233 + fVar215 * fVar163;
    fVar236 = (fVar314 * fVar234 + fVar236 * fVar227) * fVar234 + fVar227 * fVar164;
    fVar324 = (fVar323 * fVar228 + fVar237 * fVar297) * fVar228 + fVar297 * fVar241;
    fVar316 = (fVar323 * fVar229 + fVar237 * fVar300) * fVar229 + fVar300 * fVar263;
    fVar319 = (fVar323 * fVar233 + fVar237 * fVar215) * fVar233 + fVar215 * fVar302;
    fVar323 = (fVar323 * fVar234 + fVar237 * fVar227) * fVar234 + fVar227 * fVar281;
    fVar121 = fVar121 * fVar228 + (fVar279 * fVar228 + fVar235 * fVar297) * fVar297;
    fVar160 = fVar160 * fVar229 + (fVar279 * fVar229 + fVar235 * fVar300) * fVar300;
    fVar163 = fVar163 * fVar233 + (fVar279 * fVar233 + fVar235 * fVar215) * fVar215;
    fVar164 = fVar164 * fVar234 + (fVar279 * fVar234 + fVar235 * fVar227) * fVar227;
    fVar237 = fVar241 * fVar228 + (fVar283 * fVar228 + fVar238 * fVar297) * fVar297;
    fVar279 = fVar263 * fVar229 + (fVar283 * fVar229 + fVar238 * fVar300) * fVar300;
    fVar280 = fVar302 * fVar233 + (fVar283 * fVar233 + fVar238 * fVar215) * fVar215;
    fVar281 = fVar281 * fVar234 + (fVar283 * fVar234 + fVar238 * fVar227) * fVar227;
    fVar241 = fVar228 * fVar226 + fVar297 * fVar121;
    fVar263 = fVar229 * fVar231 + fVar300 * fVar160;
    fVar302 = fVar233 * fVar232 + fVar215 * fVar163;
    fVar314 = fVar234 * fVar236 + fVar227 * fVar164;
    fVar283 = fVar228 * fVar324 + fVar297 * fVar237;
    fVar297 = fVar229 * fVar316 + fVar300 * fVar279;
    fVar300 = fVar233 * fVar319 + fVar215 * fVar280;
    fVar215 = fVar234 * fVar323 + fVar227 * fVar281;
    fVar160 = (fVar160 - fVar231) * 3.0 * fVar100;
    fVar163 = (fVar163 - fVar232) * 3.0 * fVar100;
    fVar164 = (fVar164 - fVar236) * 3.0 * fVar100;
    fVar231 = (fVar279 - fVar316) * 3.0 * fVar100;
    fVar232 = (fVar280 - fVar319) * 3.0 * fVar100;
    fVar236 = (fVar281 - fVar323) * 3.0 * fVar100;
    local_208._4_4_ = fVar302;
    local_208._0_4_ = fVar263;
    local_208._8_4_ = fVar314;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar300;
    local_228._0_4_ = fVar297;
    local_228._8_4_ = fVar215;
    local_228._12_4_ = 0;
    fVar121 = fVar241 + (fVar121 - fVar226) * 3.0 * fVar100;
    fVar316 = fVar263 + fVar160;
    fVar319 = fVar302 + fVar163;
    fVar323 = fVar314 + fVar164;
    local_218 = fVar283 + (fVar237 - fVar324) * 3.0 * fVar100;
    fStack_214 = fVar297 + fVar231;
    fStack_210 = fVar300 + fVar232;
    fStack_20c = fVar215 + fVar236;
    local_248._0_4_ = fVar263 - fVar160;
    local_248._4_4_ = fVar302 - fVar163;
    local_248._8_4_ = fVar314 - fVar164;
    local_248._12_4_ = 0;
    local_238._0_4_ = fVar297 - fVar231;
    local_238._4_4_ = fVar300 - fVar232;
    local_238._8_4_ = fVar215 - fVar236;
    local_238._12_4_ = 0;
    local_1f8._8_4_ = fStack_3dc;
    local_1f8._12_4_ = 0;
    fVar324 = (fVar263 - fStack_3e4) + (fVar241 - local_3e8);
    fVar226 = (fVar302 - fStack_3e0) + (fVar263 - fStack_3e4);
    fVar231 = (fVar314 - fStack_3dc) + (fVar302 - fStack_3e0);
    fVar232 = (fVar314 - fStack_3dc) + 0.0;
    fVar100 = (fVar297 - fStack_3d4) + (fVar283 - local_3d8);
    fVar160 = (fVar300 - fStack_3d0) + (fVar297 - fStack_3d4);
    fVar163 = (fVar215 - fStack_3cc) + (fVar300 - fStack_3d0);
    fVar164 = (fVar215 - fStack_3cc) + 0.0;
    auVar183._0_8_ =
         CONCAT44(fStack_3d4 * fVar226 - fStack_3e4 * fVar160,
                  local_3d8 * fVar324 - local_3e8 * fVar100);
    auVar183._8_4_ = fStack_3d0 * fVar231 - fStack_3e0 * fVar163;
    auVar183._12_4_ = fStack_3cc * fVar232 - fStack_3dc * fVar164;
    auVar132._0_4_ = fVar101 * fVar324 - fVar165 * fVar100;
    auVar132._4_4_ = fVar102 * fVar226 - fVar296 * fVar160;
    auVar132._8_4_ = fStack_540 * fVar231 - fVar299 * fVar163;
    auVar132._12_4_ = fStack_53c * fVar232 - fVar312 * fVar164;
    auVar148._0_8_ =
         CONCAT44(local_1e8._4_4_ * fVar226 - fVar160 * local_3c8._4_4_,
                  local_1e8._0_4_ * fVar324 - fVar100 * local_3c8._0_4_);
    auVar148._8_4_ = local_1e8._8_4_ * fVar231 - fVar163 * local_3c8._8_4_;
    auVar148._12_4_ = fVar232 * 0.0 - fVar164 * 0.0;
    auVar332._0_4_ = fVar324 * fStack_3d4 - fVar100 * fStack_3e4;
    auVar332._4_4_ = fVar226 * fStack_3d0 - fVar160 * fStack_3e0;
    auVar332._8_4_ = fVar231 * fStack_3cc - fVar163 * fStack_3dc;
    auVar332._12_4_ = fVar232 * 0.0 - fVar164 * 0.0;
    auVar93._0_8_ =
         CONCAT44(fVar297 * fVar226 - fVar263 * fVar160,fVar283 * fVar324 - fVar241 * fVar100);
    auVar93._8_4_ = fVar300 * fVar231 - fVar302 * fVar163;
    auVar93._12_4_ = fVar215 * fVar232 - fVar314 * fVar164;
    auVar290._0_4_ = local_218 * fVar324 - fVar121 * fVar100;
    auVar290._4_4_ = fStack_214 * fVar226 - fVar316 * fVar160;
    auVar290._8_4_ = fStack_210 * fVar231 - fVar319 * fVar163;
    auVar290._12_4_ = fStack_20c * fVar232 - fVar323 * fVar164;
    auVar216._0_8_ =
         CONCAT44(local_238._4_4_ * fVar226 - fVar160 * local_248._4_4_,
                  local_238._0_4_ * fVar324 - fVar100 * local_248._0_4_);
    auVar216._8_4_ = local_238._8_4_ * fVar231 - fVar163 * local_248._8_4_;
    auVar216._12_4_ = fVar232 * 0.0 - fVar164 * 0.0;
    auVar270._0_4_ = fVar324 * fVar297 - fVar100 * fVar263;
    auVar270._4_4_ = fVar226 * fVar300 - fVar160 * fVar302;
    auVar270._8_4_ = fVar231 * fVar215 - fVar163 * fVar314;
    auVar270._12_4_ = fVar232 * 0.0 - fVar164 * 0.0;
    auVar326._8_4_ = auVar183._8_4_;
    auVar326._0_8_ = auVar183._0_8_;
    auVar326._12_4_ = auVar183._12_4_;
    auVar248 = minps(auVar326,auVar132);
    auVar125 = maxps(auVar183,auVar132);
    auVar133._8_4_ = auVar148._8_4_;
    auVar133._0_8_ = auVar148._0_8_;
    auVar133._12_4_ = auVar148._12_4_;
    auVar71 = minps(auVar133,auVar332);
    auVar327 = minps(auVar248,auVar71);
    auVar71 = maxps(auVar148,auVar332);
    auVar127 = maxps(auVar125,auVar71);
    auVar134._8_4_ = auVar93._8_4_;
    auVar134._0_8_ = auVar93._0_8_;
    auVar134._12_4_ = auVar93._12_4_;
    auVar125 = minps(auVar134,auVar290);
    auVar71 = maxps(auVar93,auVar290);
    auVar149._8_4_ = auVar216._8_4_;
    auVar149._0_8_ = auVar216._0_8_;
    auVar149._12_4_ = auVar216._12_4_;
    auVar248 = minps(auVar149,auVar270);
    auVar125 = minps(auVar125,auVar248);
    auVar248 = minps(auVar327,auVar125);
    auVar125 = maxps(auVar216,auVar270);
    auVar71 = maxps(auVar71,auVar125);
    auVar71 = maxps(auVar127,auVar71);
    auVar184._0_4_ =
         -(uint)(local_268 <= auVar71._0_4_ && auVar248._0_4_ <= local_258) & local_278._0_4_;
    auVar184._4_4_ =
         -(uint)(fStack_264 <= auVar71._4_4_ && auVar248._4_4_ <= fStack_254) & local_278._4_4_;
    auVar184._8_4_ =
         -(uint)(fStack_260 <= auVar71._8_4_ && auVar248._8_4_ <= fStack_250) & local_278._8_4_;
    auVar184._12_4_ =
         -(uint)(fStack_25c <= auVar71._12_4_ && auVar248._12_4_ <= fStack_24c) & local_278._12_4_;
    iVar58 = movmskps((int)uVar60,auVar184);
    uVar54 = 0;
    if (iVar58 != 0) {
      fVar324 = (fVar263 - fVar241) + (fStack_3e4 - local_3e8);
      fVar226 = (fVar302 - fVar263) + (fStack_3e0 - fStack_3e4);
      fVar231 = (fVar314 - fVar302) + (fStack_3dc - fStack_3e0);
      fVar232 = (0.0 - fVar314) + (0.0 - fStack_3dc);
      fVar100 = (fVar297 - fVar283) + (fStack_3d4 - local_3d8);
      fVar160 = (fVar300 - fVar297) + (fStack_3d0 - fStack_3d4);
      fVar163 = (fVar215 - fVar300) + (fStack_3cc - fStack_3d0);
      fVar164 = (0.0 - fVar215) + (0.0 - fStack_3cc);
      auVar333._0_8_ =
           CONCAT44(fStack_3d4 * fVar226 - fStack_3e4 * fVar160,
                    local_3d8 * fVar324 - local_3e8 * fVar100);
      auVar333._8_4_ = fStack_3d0 * fVar231 - fStack_3e0 * fVar163;
      auVar333._12_4_ = fStack_3cc * fVar232 - fStack_3dc * fVar164;
      auVar135._0_4_ = fVar101 * fVar324 - fVar165 * fVar100;
      auVar135._4_4_ = fVar102 * fVar226 - fVar296 * fVar160;
      auVar135._8_4_ = fStack_540 * fVar231 - fVar299 * fVar163;
      auVar135._12_4_ = fStack_53c * fVar232 - fVar312 * fVar164;
      auVar209._0_8_ =
           CONCAT44(local_1e8._4_4_ * fVar226 - local_3c8._4_4_ * fVar160,
                    local_1e8._0_4_ * fVar324 - local_3c8._0_4_ * fVar100);
      auVar209._8_4_ = local_1e8._8_4_ * fVar231 - local_3c8._8_4_ * fVar163;
      auVar209._12_4_ = fVar232 * 0.0 - fVar164 * 0.0;
      auVar150._0_4_ = fStack_3d4 * fVar324 - fStack_3e4 * fVar100;
      auVar150._4_4_ = fStack_3d0 * fVar226 - fStack_3e0 * fVar160;
      auVar150._8_4_ = fStack_3cc * fVar231 - fStack_3dc * fVar163;
      auVar150._12_4_ = fVar232 * 0.0 - fVar164 * 0.0;
      auVar320._0_8_ =
           CONCAT44(fVar297 * fVar226 - fVar263 * fVar160,fVar283 * fVar324 - fVar241 * fVar100);
      auVar320._8_4_ = fVar300 * fVar231 - fVar302 * fVar163;
      auVar320._12_4_ = fVar215 * fVar232 - fVar314 * fVar164;
      auVar161._0_4_ = local_218 * fVar324 - fVar121 * fVar100;
      auVar161._4_4_ = fStack_214 * fVar226 - fVar316 * fVar160;
      auVar161._8_4_ = fStack_210 * fVar231 - fVar319 * fVar163;
      auVar161._12_4_ = fStack_20c * fVar232 - fVar323 * fVar164;
      auVar291._0_8_ =
           CONCAT44(local_238._4_4_ * fVar226 - local_248._4_4_ * fVar160,
                    local_238._0_4_ * fVar324 - local_248._0_4_ * fVar100);
      auVar291._8_4_ = local_238._8_4_ * fVar231 - local_248._8_4_ * fVar163;
      auVar291._12_4_ = fVar232 * 0.0 - fVar164 * 0.0;
      auVar271._0_4_ = fVar324 * fVar297 - fVar100 * fVar263;
      auVar271._4_4_ = fVar226 * fVar300 - fVar160 * fVar302;
      auVar271._8_4_ = fVar231 * fVar215 - fVar163 * fVar314;
      auVar271._12_4_ = fVar232 * 0.0 - fVar164 * 0.0;
      auVar94._8_4_ = auVar333._8_4_;
      auVar94._0_8_ = auVar333._0_8_;
      auVar94._12_4_ = auVar333._12_4_;
      auVar71 = minps(auVar94,auVar135);
      auVar248 = maxps(auVar333,auVar135);
      auVar136._8_4_ = auVar209._8_4_;
      auVar136._0_8_ = auVar209._0_8_;
      auVar136._12_4_ = auVar209._12_4_;
      auVar125 = minps(auVar136,auVar150);
      auVar71 = minps(auVar71,auVar125);
      auVar125 = maxps(auVar209,auVar150);
      auVar327 = maxps(auVar248,auVar125);
      auVar137._8_4_ = auVar320._8_4_;
      auVar137._0_8_ = auVar320._0_8_;
      auVar137._12_4_ = auVar320._12_4_;
      auVar125 = minps(auVar137,auVar161);
      auVar127 = maxps(auVar320,auVar161);
      auVar151._8_4_ = auVar291._8_4_;
      auVar151._0_8_ = auVar291._0_8_;
      auVar151._12_4_ = auVar291._12_4_;
      auVar248 = minps(auVar151,auVar271);
      auVar125 = minps(auVar125,auVar248);
      auVar71 = minps(auVar71,auVar125);
      auVar125 = maxps(auVar291,auVar271);
      auVar125 = maxps(auVar127,auVar125);
      auVar125 = maxps(auVar327,auVar125);
      auVar334._0_4_ =
           -(uint)(local_268 <= auVar125._0_4_ && auVar71._0_4_ <= local_258) & auVar184._0_4_;
      auVar334._4_4_ =
           -(uint)(fStack_264 <= auVar125._4_4_ && auVar71._4_4_ <= fStack_254) & auVar184._4_4_;
      auVar334._8_4_ =
           -(uint)(fStack_260 <= auVar125._8_4_ && auVar71._8_4_ <= fStack_250) & auVar184._8_4_;
      auVar334._12_4_ =
           -(uint)(fStack_25c <= auVar125._12_4_ && auVar71._12_4_ <= fStack_24c) & auVar184._12_4_;
      uVar67 = movmskps(0,auVar334);
      uVar54 = (ulong)uVar67;
    }
    if ((uint)uVar54 != 0) {
      auStack_338[uVar53] = (uint)uVar54;
      *(undefined8 *)(afStack_108 + uVar53 * 2) = local_4c8;
      auStack_58[uVar53] = local_538;
      uVar53 = (ulong)((int)uVar53 + 1);
    }
    do {
      if ((int)uVar53 == 0) {
        if (local_54c != 0) {
          return local_54d;
        }
        fVar141 = *(float *)(ray + k * 4 + 0x80);
        auVar120._4_4_ = -(uint)(fStack_294 <= fVar141);
        auVar120._0_4_ = -(uint)(local_298 <= fVar141);
        auVar120._8_4_ = -(uint)(fStack_290 <= fVar141);
        auVar120._12_4_ = -(uint)(fStack_28c <= fVar141);
        uVar65 = movmskps((int)uVar54,auVar120);
        uVar64 = uVar64 & (uint)local_3f0 & uVar65;
        local_54d = uVar64 != 0;
        if (!local_54d) {
          return local_54d;
        }
        goto LAB_00c17fed;
      }
      uVar68 = (int)uVar53 - 1;
      uVar55 = (ulong)uVar68;
      uVar67 = auStack_338[uVar55];
      local_538 = auStack_58[uVar55];
      uVar54 = 0;
      if (uVar67 != 0) {
        for (; (uVar67 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
        }
      }
      uVar67 = uVar67 - 1 & uVar67;
      auStack_338[uVar55] = uVar67;
      if (uVar67 == 0) {
        uVar53 = (ulong)uVar68;
      }
      uVar59 = uVar54 + 1;
      uVar60 = uVar59;
      if ((long)uVar59 < 0) {
        uVar60 = (ulong)((uint)uVar59 & 1) | uVar59 >> 1;
      }
      fVar100 = afStack_108[uVar55 * 2];
      fVar101 = afStack_108[uVar55 * 2 + 1];
      fVar102 = fVar100 * (1.0 - (float)uVar54 * 0.33333334) + fVar101 * (float)uVar54 * 0.33333334;
      fVar121 = fVar100 * (1.0 - (float)uVar59 * 0.33333334) + fVar101 * (float)uVar59 * 0.33333334;
      fVar160 = fVar100 * 0.0 + fVar101 * 0.0;
      fVar101 = fVar100 * 0.0 + fVar101 * 0.0;
      fVar100 = fVar121 - fVar102;
      local_4c8 = CONCAT44(fVar121,fVar102);
      if (0.16666667 <= fVar100) break;
      fVar163 = (float)local_538;
      fVar164 = (float)((ulong)local_538 >> 0x20);
      fVar165 = 1.0 - fVar163;
      fVar241 = 1.0 - fVar163;
      fVar263 = 1.0 - fVar164;
      fVar296 = 1.0 - fVar164;
      fVar316 = (float)local_348 * fVar165 + (float)local_388 * fVar163;
      fVar319 = local_348._4_4_ * fVar241 + local_388._4_4_ * fVar163;
      fVar323 = (float)uStack_340 * fVar263 + (float)uStack_380 * fVar164;
      fVar324 = uStack_340._4_4_ * fVar296 + uStack_380._4_4_ * fVar164;
      fVar237 = (float)local_358 * fVar165 + (float)local_398 * fVar163;
      fVar279 = local_358._4_4_ * fVar241 + local_398._4_4_ * fVar163;
      fVar280 = (float)uStack_350 * fVar263 + (float)uStack_390 * fVar164;
      fVar281 = uStack_350._4_4_ * fVar296 + uStack_390._4_4_ * fVar164;
      fVar283 = (float)local_368 * fVar165 + (float)local_3a8 * fVar163;
      fVar300 = local_368._4_4_ * fVar241 + local_3a8._4_4_ * fVar163;
      fVar227 = (float)uStack_360 * fVar263 + (float)uStack_3a0 * fVar164;
      fVar229 = uStack_360._4_4_ * fVar296 + uStack_3a0._4_4_ * fVar164;
      fVar226 = (fVar165 * (float)local_378 + fVar163 * (float)local_3b8) - fVar283;
      fVar231 = (fVar241 * local_378._4_4_ + fVar163 * local_3b8._4_4_) - fVar300;
      fVar232 = (fVar263 * (float)uStack_370 + fVar164 * (float)uStack_3b0) - fVar227;
      fVar236 = (fVar296 * uStack_370._4_4_ + fVar164 * uStack_3b0._4_4_) - fVar229;
      fVar163 = fVar102 * (fVar283 - fVar237) + fVar237;
      fVar164 = fVar102 * (fVar300 - fVar279) + fVar279;
      fVar165 = fVar102 * (fVar227 - fVar280) + fVar280;
      fVar241 = fVar102 * (fVar229 - fVar281) + fVar281;
      fVar297 = (fVar283 - fVar237) * fVar121 + fVar237;
      fVar215 = (fVar300 - fVar279) * fVar121 + fVar279;
      fVar228 = (fVar227 - fVar280) * fVar121 + fVar280;
      fVar233 = (fVar229 - fVar281) * fVar121 + fVar281;
      fVar263 = fVar102 * (fVar237 - fVar316) + fVar316;
      fVar296 = fVar102 * (fVar279 - fVar319) + fVar319;
      fVar302 = fVar102 * (fVar280 - fVar323) + fVar323;
      fVar314 = fVar102 * (fVar281 - fVar324) + fVar324;
      fVar263 = (fVar163 - fVar263) * fVar102 + fVar263;
      fVar296 = (fVar164 - fVar296) * fVar102 + fVar296;
      fVar302 = (fVar165 - fVar302) * fVar102 + fVar302;
      fVar314 = (fVar241 - fVar314) * fVar102 + fVar314;
      fVar163 = (((fVar102 * fVar226 + fVar283) - fVar163) * fVar102 + fVar163) - fVar263;
      fVar164 = (((fVar102 * fVar231 + fVar300) - fVar164) * fVar102 + fVar164) - fVar296;
      fVar165 = (((fVar102 * fVar232 + fVar227) - fVar165) * fVar102 + fVar165) - fVar302;
      fVar241 = (((fVar102 * fVar236 + fVar229) - fVar241) * fVar102 + fVar241) - fVar314;
      fVar263 = fVar102 * fVar163 + fVar263;
      fVar296 = fVar102 * fVar164 + fVar296;
      fVar302 = fVar102 * fVar165 + fVar302;
      fVar314 = fVar102 * fVar241 + fVar314;
      fVar316 = (fVar237 - fVar316) * fVar121 + fVar316;
      fVar319 = (fVar279 - fVar319) * fVar121 + fVar319;
      fVar323 = (fVar280 - fVar323) * fVar121 + fVar323;
      fVar324 = (fVar281 - fVar324) * fVar121 + fVar324;
      fVar316 = (fVar297 - fVar316) * fVar121 + fVar316;
      fVar319 = (fVar215 - fVar319) * fVar121 + fVar319;
      fVar323 = (fVar228 - fVar323) * fVar121 + fVar323;
      fVar324 = (fVar233 - fVar324) * fVar121 + fVar324;
      fVar237 = (((fVar226 * fVar121 + fVar283) - fVar297) * fVar121 + fVar297) - fVar316;
      fVar279 = (((fVar231 * fVar121 + fVar300) - fVar215) * fVar121 + fVar215) - fVar319;
      fVar280 = (((fVar232 * fVar121 + fVar227) - fVar228) * fVar121 + fVar228) - fVar323;
      fVar281 = (((fVar236 * fVar121 + fVar229) - fVar233) * fVar121 + fVar233) - fVar324;
      fVar316 = fVar121 * fVar237 + fVar316;
      fVar319 = fVar121 * fVar279 + fVar319;
      fVar323 = fVar121 * fVar280 + fVar323;
      fVar324 = fVar121 * fVar281 + fVar324;
      fVar283 = fVar100 * 0.33333334;
      fVar226 = fVar163 * 3.0 * fVar283 + fVar263;
      fVar231 = fVar164 * 3.0 * fVar283 + fVar296;
      fVar232 = fVar165 * 3.0 * fVar283 + fVar302;
      fVar236 = fVar241 * 3.0 * fVar283 + fVar314;
      fVar237 = fVar316 - fVar283 * fVar237 * 3.0;
      fVar279 = fVar319 - fVar283 * fVar279 * 3.0;
      fVar280 = fVar323 - fVar283 * fVar280 * 3.0;
      fVar281 = fVar324 - fVar283 * fVar281 * 3.0;
      local_538 = CONCAT44(fVar314,fVar302);
      fVar215 = (fVar323 - fVar316) + (fVar302 - fVar263);
      fVar227 = (fVar324 - fVar319) + (fVar314 - fVar296);
      auVar217._0_4_ = fVar227 * fVar319;
      auVar217._4_4_ = fVar227 * fVar319;
      auVar217._8_4_ = fVar227 * fVar324;
      auVar217._12_4_ = fVar227 * fVar324;
      fVar163 = fVar263 * fVar215 + fVar296 * fVar227;
      fVar164 = fVar302 * fVar215 + fVar314 * fVar227;
      fVar228 = fVar226 * fVar215 + fVar231 * fVar227;
      fVar229 = fVar232 * fVar215 + fVar236 * fVar227;
      fVar283 = fVar237 * fVar215 + fVar279 * fVar227;
      auVar249._4_4_ = fVar279 * fVar215 + fVar279 * fVar227;
      auVar249._0_4_ = fVar283;
      fVar297 = fVar280 * fVar215 + fVar281 * fVar227;
      fVar165 = fVar215 * fVar316 + auVar217._0_4_;
      fVar300 = fVar215 * fVar323 + auVar217._8_4_;
      auVar21._4_8_ = auVar217._8_8_;
      auVar21._0_4_ = fVar231 * fVar215 + fVar231 * fVar227;
      auVar218._0_8_ = auVar21._0_8_ << 0x20;
      auVar218._8_4_ = fVar229;
      auVar218._12_4_ = fVar236 * fVar215 + fVar236 * fVar227;
      fVar241 = fVar228;
      if (fVar228 <= fVar163) {
        fVar241 = fVar163;
        fVar163 = fVar228;
      }
      auVar219._8_8_ = auVar218._8_8_;
      auVar219._0_8_ = auVar219._8_8_;
      auVar249._8_4_ = fVar297;
      auVar249._12_4_ = fVar281 * fVar215 + fVar281 * fVar227;
      if (fVar165 <= fVar283) {
        auVar249._0_4_ = fVar165;
      }
      if (auVar249._0_4_ <= fVar163) {
        fVar163 = auVar249._0_4_;
      }
      auVar22._4_8_ = auVar249._8_8_;
      auVar22._0_4_ = fVar215 * fVar319 + auVar217._4_4_;
      auVar250._0_8_ = auVar22._0_8_ << 0x20;
      auVar250._8_4_ = fVar300;
      auVar250._12_4_ = fVar215 * fVar324 + auVar217._12_4_;
      if (fVar165 <= fVar283) {
        fVar165 = fVar283;
      }
      auVar251._8_8_ = auVar250._8_8_;
      auVar251._0_8_ = auVar251._8_8_;
      if (fVar165 <= fVar241) {
        fVar165 = fVar241;
      }
      if (fVar229 <= fVar164) {
        auVar219._0_4_ = fVar164;
        fVar164 = fVar229;
      }
      fVar241 = fVar297;
      if (fVar300 <= fVar297) {
        fVar241 = fVar300;
      }
      if (fVar241 <= fVar164) {
        fVar164 = fVar241;
      }
      if (fVar300 <= fVar297) {
        auVar251._0_4_ = fVar297;
      }
      if (auVar251._0_4_ <= auVar219._0_4_) {
        auVar251._0_4_ = auVar219._0_4_;
      }
      uVar60 = CONCAT71((int7)(uVar60 >> 8),fVar100 < 0.001);
      bVar63 = 3 < (uint)uVar53;
      uVar23 = (undefined3)(uVar68 >> 8);
      uVar54 = (ulong)CONCAT31(uVar23,bVar63);
      fVar241 = auVar251._0_4_;
      if ((0.0001 <= fVar163) || (fVar241 <= -0.0001)) {
        if ((-0.0001 < fVar165 && fVar164 < 0.0001) ||
           ((fVar163 < 0.0001 && -0.0001 < fVar165 || (fVar164 < 0.0001 && -0.0001 < fVar241))))
        goto LAB_00c197f2;
        bVar26 = true;
      }
      else {
LAB_00c197f2:
        bVar63 = bVar63 || fVar100 < 0.001;
        uVar54 = (ulong)CONCAT31(uVar23,bVar63);
        fVar300 = (float)(~-(uint)(fVar163 < 0.0) & 0x3f800000 | -(uint)(fVar163 < 0.0) & 0xbf800000
                         );
        fVar297 = (float)(~-(uint)(fVar165 < 0.0) & 0x3f800000 | -(uint)(fVar165 < 0.0) & 0xbf800000
                         );
        fVar283 = 0.0;
        if ((fVar300 == fVar297) && (!NAN(fVar300) && !NAN(fVar297))) {
          fVar283 = INFINITY;
        }
        fVar215 = 0.0;
        if ((fVar300 == fVar297) && (!NAN(fVar300) && !NAN(fVar297))) {
          fVar215 = -INFINITY;
        }
        fVar227 = (float)(~-(uint)(fVar164 < 0.0) & 0x3f800000 | -(uint)(fVar164 < 0.0) & 0xbf800000
                         );
        if ((fVar300 != fVar227) || (fVar228 = fVar215, NAN(fVar300) || NAN(fVar227))) {
          if ((fVar164 != fVar163) || (NAN(fVar164) || NAN(fVar163))) {
            fVar164 = -fVar163 / (fVar164 - fVar163);
            fVar164 = (1.0 - fVar164) * 0.0 + fVar164;
            fVar228 = fVar164;
          }
          else {
            fVar164 = INFINITY;
            if ((fVar163 == 0.0) && (fVar164 = INFINITY, !NAN(fVar163))) {
              fVar164 = 0.0;
            }
            fVar228 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar163 == 0.0) & 1) * 4);
          }
          if (fVar164 <= fVar283) {
            fVar283 = fVar164;
          }
          if (fVar228 <= fVar215) {
            fVar228 = fVar215;
          }
        }
        uVar60 = (ulong)(fVar241 < 0.0);
        fVar163 = *(float *)(&DAT_01ff1ecc + uVar60 * 4);
        if ((fVar297 != fVar163) || (fVar164 = fVar228, NAN(fVar297) || NAN(fVar163))) {
          if ((fVar241 != fVar165) || (NAN(fVar241) || NAN(fVar165))) {
            fVar241 = -fVar165 / (fVar241 - fVar165);
            fVar241 = (1.0 - fVar241) * 0.0 + fVar241;
            fVar164 = fVar241;
          }
          else {
            fVar241 = INFINITY;
            if ((fVar165 == 0.0) && (fVar241 = INFINITY, !NAN(fVar165))) {
              fVar241 = 0.0;
            }
            uVar60 = (ulong)(-(uint)(fVar165 == 0.0) & 1);
            fVar164 = *(float *)(&DAT_01ff1ec4 + uVar60 * 4);
          }
          if (fVar241 <= fVar283) {
            fVar283 = fVar241;
          }
          if (fVar164 <= fVar228) {
            fVar164 = fVar228;
          }
        }
        if ((fVar227 != fVar163) || (NAN(fVar227) || NAN(fVar163))) {
          fVar283 = (float)(~-(uint)(fVar283 < 1.0) & 0x3f800000 |
                           (uint)fVar283 & -(uint)(fVar283 < 1.0));
          fVar164 = (float)(~-(uint)(fVar164 < 1.0) & (uint)fVar164 |
                           -(uint)(fVar164 < 1.0) & 0x3f800000);
        }
        fVar283 = (float)(~-(uint)(fVar283 < 0.0) & (uint)fVar283);
        fVar163 = (float)(~-(uint)(fVar164 < 1.0) & 0x3f800000 |
                         (uint)fVar164 & -(uint)(fVar164 < 1.0));
        bVar26 = true;
        if (fVar283 <= fVar163) {
          fVar283 = fVar283 + -0.1;
          fVar163 = fVar163 + 0.1;
          uVar67 = -(uint)(fVar163 < 1.0);
          fVar283 = (float)(~-(uint)(fVar283 < 0.0) & (uint)fVar283);
          fVar228 = (float)(~uVar67 & 0x3f800000 | (uint)fVar163 & uVar67);
          fVar297 = 1.0 - fVar283;
          fVar300 = 1.0 - fVar283;
          fVar215 = 1.0 - fVar228;
          fVar227 = 1.0 - fVar228;
          fVar163 = fVar263 * fVar297 + fVar302 * fVar283;
          fVar164 = fVar296 * fVar300 + fVar314 * fVar283;
          fVar165 = fVar263 * fVar215 + fStack_540 * fVar228;
          fVar241 = fVar296 * fVar227 + fStack_53c * fVar228;
          fVar263 = fVar226 * fVar297 + fVar232 * fVar283;
          fVar296 = fVar231 * fVar300 + fVar236 * fVar283;
          fVar226 = fVar226 * fVar215 + fVar232 * fVar228;
          fVar231 = fVar231 * fVar227 + fVar236 * fVar228;
          fVar232 = fVar237 * fVar297 + fVar280 * fVar283;
          fVar236 = fVar279 * fVar300 + fVar281 * fVar283;
          fVar237 = fVar237 * fVar215 + fVar280 * fVar228;
          fVar279 = fVar279 * fVar227 + fVar281 * fVar228;
          fVar280 = fVar297 * fVar316 + fVar323 * fVar283;
          fVar281 = fVar300 * fVar319 + fVar324 * fVar283;
          fVar316 = fVar215 * fVar316 + fVar299 * fVar228;
          fVar319 = fVar227 * fVar319 + fVar312 * fVar228;
          fVar256 = fVar302 * (1.0 - fVar283) + fVar314 * fVar283;
          fStack_53c = fVar302 * (1.0 - fVar228) + fVar314 * fVar228;
          fVar100 = 1.0 / fVar100;
          auVar117._0_4_ = fVar316 - fVar280;
          auVar117._4_4_ = fVar319 - fVar281;
          auVar117._8_4_ = fVar316 - fVar316;
          auVar117._12_4_ = fVar319 - fVar319;
          auVar152._0_8_ = CONCAT44(fVar279 - fVar236,fVar237 - fVar232);
          auVar152._8_4_ = fVar237 - fVar237;
          auVar152._12_4_ = fVar279 - fVar279;
          auVar272._0_4_ = fVar226 - fVar263;
          auVar272._4_4_ = fVar231 - fVar296;
          auVar272._8_4_ = fVar226 - fVar226;
          auVar272._12_4_ = fVar231 - fVar231;
          auVar210._0_8_ = CONCAT44((fVar296 - fVar164) * 3.0,(fVar263 - fVar163) * 3.0);
          auVar210._8_4_ = (fVar226 - fVar165) * 3.0;
          auVar210._12_4_ = (fVar231 - fVar241) * 3.0;
          auVar185._0_8_ = CONCAT44((fVar236 - fVar296) * 3.0,(fVar232 - fVar263) * 3.0);
          auVar185._8_4_ = (fVar237 - fVar226) * 3.0;
          auVar185._12_4_ = (fVar279 - fVar231) * 3.0;
          auVar252._0_4_ = (fVar280 - fVar232) * 3.0;
          auVar252._4_4_ = (fVar281 - fVar236) * 3.0;
          auVar252._8_4_ = (fVar316 - fVar237) * 3.0;
          auVar252._12_4_ = (fVar319 - fVar279) * 3.0;
          auVar193._8_4_ = auVar185._8_4_;
          auVar193._0_8_ = auVar185._0_8_;
          auVar193._12_4_ = auVar185._12_4_;
          auVar125 = minps(auVar193,auVar252);
          auVar71 = maxps(auVar185,auVar252);
          auVar220._8_4_ = auVar210._8_4_;
          auVar220._0_8_ = auVar210._0_8_;
          auVar220._12_4_ = auVar210._12_4_;
          auVar127 = minps(auVar220,auVar125);
          auVar248 = maxps(auVar210,auVar71);
          auVar24._4_8_ = auVar71._8_8_;
          auVar24._0_4_ = auVar127._4_4_;
          auVar186._0_8_ = auVar24._0_8_ << 0x20;
          auVar186._8_4_ = auVar127._8_4_;
          auVar186._12_4_ = auVar127._12_4_;
          auVar187._8_8_ = auVar127._8_8_;
          auVar187._0_8_ = auVar186._8_8_;
          auVar25._4_8_ = auVar125._8_8_;
          auVar25._0_4_ = auVar248._4_4_;
          auVar194._0_8_ = auVar25._0_8_ << 0x20;
          auVar194._8_4_ = auVar248._8_4_;
          auVar194._12_4_ = auVar248._12_4_;
          auVar195._8_8_ = auVar248._8_8_;
          auVar195._0_8_ = auVar194._8_8_;
          auVar125 = minps(auVar127,auVar187);
          auVar71 = maxps(auVar248,auVar195);
          fVar228 = auVar125._0_4_ * fVar100;
          fVar229 = auVar125._4_4_ * fVar100;
          fVar233 = auVar125._8_4_ * fVar100;
          fVar234 = auVar125._12_4_ * fVar100;
          fVar232 = fVar100 * auVar71._0_4_;
          fVar237 = fVar100 * auVar71._4_4_;
          fVar280 = fVar100 * auVar71._8_4_;
          fVar100 = fVar100 * auVar71._12_4_;
          fVar215 = 1.0 / (fStack_53c - fVar256);
          auVar138._0_8_ = CONCAT44(fVar241 - fVar164,fVar165 - fVar163);
          auVar138._8_4_ = fVar165 - fVar165;
          auVar138._12_4_ = fVar241 - fVar241;
          auVar196._8_4_ = auVar138._8_4_;
          auVar196._0_8_ = auVar138._0_8_;
          auVar196._12_4_ = auVar138._12_4_;
          auVar248 = minps(auVar196,auVar272);
          auVar125 = maxps(auVar138,auVar272);
          auVar95._8_4_ = auVar152._8_4_;
          auVar95._0_8_ = auVar152._0_8_;
          auVar95._12_4_ = auVar152._12_4_;
          auVar71 = minps(auVar95,auVar117);
          auVar248 = minps(auVar248,auVar71);
          auVar71 = maxps(auVar152,auVar117);
          auVar71 = maxps(auVar125,auVar71);
          fVar297 = auVar248._0_4_ * fVar215;
          fVar300 = auVar248._4_4_ * fVar215;
          fVar227 = fVar215 * auVar71._0_4_;
          fVar215 = fVar215 * auVar71._4_4_;
          local_538 = CONCAT44(fStack_53c,fVar256);
          auVar188._4_4_ = fStack_53c;
          auVar188._0_4_ = fVar121;
          auVar188._8_4_ = fVar160;
          auVar188._12_4_ = fVar101;
          fVar163 = (fVar102 + fVar121) * 0.5;
          fVar164 = (fVar256 + fStack_53c) * 0.5;
          fVar165 = (fVar121 + fVar160) * 0.0;
          fVar241 = (fStack_53c + fVar101) * 0.0;
          fVar263 = local_118 * fVar163 + fVar282;
          fVar302 = fStack_114 * fVar163 + fVar293;
          fVar296 = fStack_110 * fVar163 + fVar201;
          fVar314 = fStack_10c * fVar163 + fVar203;
          fVar316 = local_128 * fVar163 + fVar274;
          fVar319 = fStack_124 * fVar163 + fVar277;
          fVar226 = fStack_120 * fVar163 + fVar213;
          fVar231 = fStack_11c * fVar163 + fVar258;
          fVar263 = (fVar316 - fVar263) * fVar163 + fVar263;
          fVar302 = (fVar319 - fVar302) * fVar163 + fVar302;
          fVar296 = (fVar226 - fVar296) * fVar163 + fVar296;
          fVar314 = (fVar231 - fVar314) * fVar163 + fVar314;
          fVar316 = (((local_138 * fVar163 + fVar189) - fVar316) * fVar163 + fVar316) - fVar263;
          fVar319 = (((fStack_134 * fVar163 + fVar191) - fVar319) * fVar163 + fVar319) - fVar302;
          fVar226 = (((fStack_130 * fVar163 + fVar214) - fVar226) * fVar163 + fVar226) - fVar296;
          fVar231 = (((fStack_12c * fVar163 + fVar230) - fVar231) * fVar163 + fVar231) - fVar314;
          fVar263 = fVar163 * fVar316 + fVar263;
          fVar302 = fVar163 * fVar319 + fVar302;
          fVar316 = fVar316 * 3.0;
          fVar319 = fVar319 * 3.0;
          fVar296 = (fVar163 * fVar226 + fVar296) - fVar263;
          fVar314 = (fVar163 * fVar231 + fVar314) - fVar302;
          fVar316 = (fVar226 * 3.0 - fVar316) * fVar164 + fVar316;
          fVar319 = (fVar231 * 3.0 - fVar319) * fVar164 + fVar319;
          auVar118._0_8_ = CONCAT44(fVar316,fVar296) ^ 0x80000000;
          auVar118._8_4_ = fVar316;
          auVar118._12_4_ = fVar316;
          fVar235 = fVar102 - fVar163;
          fVar238 = fVar256 - fVar164;
          fVar239 = fVar121 - fVar165;
          fVar240 = fStack_53c - fVar241;
          fVar242 = fVar121 - fVar163;
          fVar243 = fStack_53c - fVar164;
          fVar160 = fVar160 - fVar165;
          fVar101 = fVar101 - fVar241;
          fVar263 = fVar296 * fVar164 + fVar263;
          fVar302 = fVar314 * fVar164 + fVar302;
          auVar139._0_8_ = CONCAT44(fVar319,fVar314) ^ 0x8000000000000000;
          auVar139._8_4_ = -fVar319;
          auVar139._12_4_ = -fVar319;
          auVar309._0_4_ = fVar314 * fVar316 - fVar319 * fVar296;
          auVar309._4_4_ = auVar309._0_4_;
          auVar309._8_4_ = auVar309._0_4_;
          auVar309._12_4_ = auVar309._0_4_;
          auVar125 = divps(auVar139,auVar309);
          auVar71 = divps(auVar118,auVar309);
          fVar316 = auVar125._0_4_;
          fVar319 = auVar125._4_4_;
          fVar296 = auVar71._0_4_;
          fVar314 = auVar71._4_4_;
          fVar163 = fVar163 - (fVar302 * fVar296 + fVar263 * fVar316);
          fVar165 = fVar164 - (fVar302 * fVar314 + fVar263 * fVar319);
          fVar241 = fVar164 - (fVar302 * auVar71._8_4_ + fVar263 * auVar125._8_4_);
          fVar164 = fVar164 - (fVar302 * auVar71._12_4_ + fVar263 * auVar125._12_4_);
          auVar328._0_8_ = CONCAT44(fVar319 * fVar297,fVar319 * fVar228);
          auVar328._8_4_ = fVar319 * fVar229;
          auVar328._12_4_ = fVar319 * fVar300;
          auVar253._0_4_ = fVar319 * fVar232;
          auVar253._4_4_ = fVar319 * fVar227;
          auVar253._8_4_ = fVar319 * fVar237;
          auVar253._12_4_ = fVar319 * fVar215;
          auVar335._8_4_ = auVar328._8_4_;
          auVar335._0_8_ = auVar328._0_8_;
          auVar335._12_4_ = auVar328._12_4_;
          auVar127 = minps(auVar335,auVar253);
          auVar125 = maxps(auVar253,auVar328);
          auVar153._0_8_ = CONCAT44(fVar314 * fVar300,fVar314 * fVar229);
          auVar153._8_4_ = fVar314 * fVar233;
          auVar153._12_4_ = fVar314 * fVar234;
          auVar329._0_4_ = fVar314 * fVar237;
          auVar329._4_4_ = fVar314 * fVar215;
          auVar329._8_4_ = fVar314 * fVar280;
          auVar329._12_4_ = fVar314 * fVar100;
          auVar221._8_4_ = auVar153._8_4_;
          auVar221._0_8_ = auVar153._0_8_;
          auVar221._12_4_ = auVar153._12_4_;
          auVar71 = minps(auVar221,auVar329);
          auVar248 = maxps(auVar329,auVar153);
          fVar263 = 0.0 - (auVar248._0_4_ + auVar125._0_4_);
          fVar302 = 1.0 - (auVar248._4_4_ + auVar125._4_4_);
          fVar226 = 0.0 - (auVar248._8_4_ + auVar125._8_4_);
          fVar231 = 0.0 - (auVar248._12_4_ + auVar125._12_4_);
          fVar236 = 0.0 - (auVar71._0_4_ + auVar127._0_4_);
          fVar279 = 1.0 - (auVar71._4_4_ + auVar127._4_4_);
          fVar281 = 0.0 - (auVar71._8_4_ + auVar127._8_4_);
          fVar283 = 0.0 - (auVar71._12_4_ + auVar127._12_4_);
          auVar254._0_8_ = CONCAT44(fVar238 * fVar302,fVar235 * fVar263);
          auVar254._8_4_ = fVar239 * fVar226;
          auVar254._12_4_ = fVar240 * fVar231;
          auVar310._0_8_ = CONCAT44(fVar297 * fVar316,fVar228 * fVar316);
          auVar310._8_4_ = fVar229 * fVar316;
          auVar310._12_4_ = fVar300 * fVar316;
          auVar222._0_4_ = fVar316 * fVar232;
          auVar222._4_4_ = fVar316 * fVar227;
          auVar222._8_4_ = fVar316 * fVar237;
          auVar222._12_4_ = fVar316 * fVar215;
          auVar321._8_4_ = auVar310._8_4_;
          auVar321._0_8_ = auVar310._0_8_;
          auVar321._12_4_ = auVar310._12_4_;
          auVar125 = minps(auVar321,auVar222);
          auVar71 = maxps(auVar222,auVar310);
          auVar197._0_8_ = CONCAT44(fVar300 * fVar296,fVar229 * fVar296);
          auVar197._8_4_ = fVar233 * fVar296;
          auVar197._12_4_ = fVar234 * fVar296;
          auVar330._0_4_ = fVar296 * fVar237;
          auVar330._4_4_ = fVar296 * fVar215;
          auVar330._8_4_ = fVar296 * fVar280;
          auVar330._12_4_ = fVar296 * fVar100;
          auVar336._8_4_ = auVar197._8_4_;
          auVar336._0_8_ = auVar197._0_8_;
          auVar336._12_4_ = auVar197._12_4_;
          auVar127 = minps(auVar336,auVar330);
          auVar311._0_4_ = fVar235 * fVar236;
          auVar311._4_4_ = fVar238 * fVar279;
          auVar311._8_4_ = fVar239 * fVar281;
          auVar311._12_4_ = fVar240 * fVar283;
          auVar154._0_8_ = CONCAT44(fVar302 * fVar243,fVar263 * fVar242);
          auVar154._8_4_ = fVar226 * fVar160;
          auVar154._12_4_ = fVar231 * fVar101;
          auVar162._0_4_ = fVar236 * fVar242;
          auVar162._4_4_ = fVar279 * fVar243;
          auVar162._8_4_ = fVar281 * fVar160;
          auVar162._12_4_ = fVar283 * fVar101;
          auVar248 = maxps(auVar330,auVar197);
          fVar100 = 1.0 - (auVar248._0_4_ + auVar71._0_4_);
          fVar263 = 0.0 - (auVar248._4_4_ + auVar71._4_4_);
          fVar302 = 0.0 - (auVar248._8_4_ + auVar71._8_4_);
          fVar226 = 0.0 - (auVar248._12_4_ + auVar71._12_4_);
          fVar231 = 1.0 - (auVar127._0_4_ + auVar125._0_4_);
          fVar232 = 0.0 - (auVar127._4_4_ + auVar125._4_4_);
          fVar236 = 0.0 - (auVar127._8_4_ + auVar125._8_4_);
          fVar237 = 0.0 - (auVar127._12_4_ + auVar125._12_4_);
          auVar223._0_8_ = CONCAT44(fVar238 * fVar263,fVar235 * fVar100);
          auVar223._8_4_ = fVar239 * fVar302;
          auVar223._12_4_ = fVar240 * fVar226;
          auVar273._0_4_ = fVar235 * fVar231;
          auVar273._4_4_ = fVar238 * fVar232;
          auVar273._8_4_ = fVar239 * fVar236;
          auVar273._12_4_ = fVar240 * fVar237;
          auVar198._0_8_ = CONCAT44(fVar263 * fVar243,fVar100 * fVar242);
          auVar198._8_4_ = fVar302 * fVar160;
          auVar198._12_4_ = fVar226 * fVar101;
          auVar211._0_4_ = fVar231 * fVar242;
          auVar211._4_4_ = fVar232 * fVar243;
          auVar211._8_4_ = fVar236 * fVar160;
          auVar211._12_4_ = fVar237 * fVar101;
          auVar292._8_4_ = auVar223._8_4_;
          auVar292._0_8_ = auVar223._0_8_;
          auVar292._12_4_ = auVar223._12_4_;
          auVar71 = minps(auVar292,auVar273);
          auVar322._8_4_ = auVar198._8_4_;
          auVar322._0_8_ = auVar198._0_8_;
          auVar322._12_4_ = auVar198._12_4_;
          auVar125 = minps(auVar322,auVar211);
          auVar127 = minps(auVar71,auVar125);
          auVar125 = maxps(auVar273,auVar223);
          auVar71 = maxps(auVar211,auVar198);
          auVar248 = maxps(auVar71,auVar125);
          auVar199._8_4_ = auVar254._8_4_;
          auVar199._0_8_ = auVar254._0_8_;
          auVar199._12_4_ = auVar254._12_4_;
          auVar71 = minps(auVar199,auVar311);
          auVar224._8_4_ = auVar154._8_4_;
          auVar224._0_8_ = auVar154._0_8_;
          auVar224._12_4_ = auVar154._12_4_;
          auVar125 = minps(auVar224,auVar162);
          auVar125 = minps(auVar71,auVar125);
          auVar327 = maxps(auVar311,auVar254);
          auVar71 = maxps(auVar162,auVar154);
          auVar71 = maxps(auVar71,auVar327);
          auVar200._0_4_ = auVar127._4_4_ + auVar127._0_4_ + fVar163;
          auVar200._4_4_ = auVar125._4_4_ + auVar125._0_4_ + fVar165;
          auVar200._8_4_ = auVar127._8_4_ + auVar127._4_4_ + fVar241;
          auVar200._12_4_ = auVar127._12_4_ + auVar125._4_4_ + fVar164;
          fVar100 = auVar248._4_4_ + auVar248._0_4_ + fVar163;
          fVar101 = auVar71._4_4_ + auVar71._0_4_ + fVar165;
          auVar155._4_4_ = fVar101;
          auVar155._0_4_ = fVar100;
          auVar28._4_4_ = fVar256;
          auVar28._0_4_ = fVar102;
          auVar28._8_4_ = fVar121;
          auVar28._12_4_ = fStack_53c;
          auVar125 = maxps(auVar28,auVar200);
          auVar155._8_4_ = auVar248._8_4_ + auVar248._4_4_ + fVar241;
          auVar155._12_4_ = auVar248._12_4_ + auVar71._4_4_ + fVar164;
          auVar71 = minps(auVar155,auVar188);
          iVar58 = -(uint)(auVar71._0_4_ < auVar125._0_4_);
          iVar66 = -(uint)(auVar71._4_4_ < auVar125._4_4_);
          auVar157._4_4_ = iVar66;
          auVar157._0_4_ = iVar58;
          auVar157._8_4_ = iVar66;
          auVar157._12_4_ = iVar66;
          auVar156._8_8_ = auVar157._8_8_;
          auVar156._4_4_ = iVar58;
          auVar156._0_4_ = iVar58;
          uVar67 = movmskpd((int)uVar60,auVar156);
          uVar60 = (ulong)uVar67;
          fStack_540 = fVar121;
          if (uVar67 == 0) {
            uVar60 = 0;
            if ((fVar102 < auVar200._0_4_) && (fVar100 < fVar121)) {
              iVar58 = -(uint)(fVar101 < fStack_53c);
              uVar60 = (ulong)CONCAT11((char)((uint)iVar58 >> 8),
                                       (byte)iVar58 & fVar256 < auVar200._4_4_);
            }
            bVar51 = bVar63 | (byte)uVar60;
            uVar54 = (ulong)CONCAT31(uVar23,bVar51);
            if (bVar51 == 1) {
              uVar54 = 200;
              do {
                fVar101 = 1.0 - fVar163;
                fVar160 = fVar163 * fVar163 * fVar163;
                fVar121 = fVar163 * fVar163 * 3.0 * fVar101;
                fVar100 = fVar101 * fVar101 * fVar101;
                fVar164 = fVar163 * 3.0 * fVar101 * fVar101;
                fVar101 = fVar100 * fVar282 +
                          fVar164 * fVar274 + fVar121 * fVar189 + fVar160 * (float)local_148._0_4_;
                fVar102 = fVar100 * fVar293 +
                          fVar164 * fVar277 + fVar121 * fVar191 + fVar160 * (float)local_148._4_4_;
                fVar101 = ((fVar100 * fVar201 +
                           fVar164 * fVar213 + fVar121 * fVar214 + fVar160 * fStack_140) - fVar101)
                          * fVar165 + fVar101;
                fVar102 = ((fVar100 * fVar203 +
                           fVar164 * fVar258 + fVar121 * fVar230 + fVar160 * fStack_13c) - fVar102)
                          * fVar165 + fVar102;
                fVar163 = fVar163 - (fVar102 * fVar296 + fVar101 * fVar316);
                fVar165 = fVar165 - (fVar102 * fVar314 + fVar101 * fVar319);
                fVar100 = ABS(fVar102);
                if (ABS(fVar102) <= ABS(fVar101)) {
                  fVar100 = ABS(fVar101);
                }
                if (fVar100 < fVar141) {
                  if ((((0.0 <= fVar163) && (fVar163 <= 1.0)) && (0.0 <= fVar165)) &&
                     (fVar165 <= 1.0)) {
                    fVar100 = pre->ray_space[k].vx.field_0.m128[2];
                    fVar101 = pre->ray_space[k].vy.field_0.m128[2];
                    fVar102 = pre->ray_space[k].vz.field_0.m128[2];
                    fVar296 = 1.0 - fVar165;
                    fVar263 = 1.0 - fVar163;
                    fVar121 = fVar263 * fVar263 * fVar263;
                    fVar160 = fVar163 * 3.0 * fVar263 * fVar263;
                    fVar241 = fVar163 * fVar163 * fVar163;
                    fVar164 = fVar163 * fVar163 * 3.0 * fVar263;
                    fVar100 = ((fStack_150 * fVar102 + fStack_154 * fVar101 + local_158 * fVar100) *
                               fVar296 +
                              (fStack_190 * fVar102 + fStack_194 * fVar101 + local_198 * fVar100) *
                              fVar165) * fVar121 +
                              ((fStack_160 * fVar102 + fStack_164 * fVar101 + local_168 * fVar100) *
                               fVar296 +
                              (fStack_1a0 * fVar102 + fStack_1a4 * fVar101 + local_1a8 * fVar100) *
                              fVar165) * fVar160 +
                              ((fStack_170 * fVar102 + fStack_174 * fVar101 + local_178 * fVar100) *
                               fVar296 +
                              (fStack_1b0 * fVar102 + fStack_1b4 * fVar101 + local_1b8 * fVar100) *
                              fVar165) * fVar164 +
                              (fVar296 * (fStack_180 * fVar102 +
                                         fStack_184 * fVar101 + local_188 * fVar100) +
                              (fVar102 * fStack_1c0 + fVar101 * fStack_1c4 + fVar100 * local_1c8) *
                              fVar165) * fVar241;
                    if ((fVar70 <= fVar100) &&
                       (fVar101 = *(float *)(ray + k * 4 + 0x80), fVar100 <= fVar101)) {
                      fVar314 = 1.0 - fVar165;
                      fVar316 = 1.0 - fVar165;
                      fVar319 = 1.0 - fVar165;
                      fVar102 = fVar325 * fVar314 + fVar255 * fVar165;
                      fVar296 = fVar264 * fVar316 + fVar318 * fVar165;
                      fVar302 = fVar276 * fVar319 + fVar225 * fVar165;
                      fVar226 = fVar190 * fVar314 + fVar123 * fVar165;
                      fVar232 = fVar202 * fVar316 + fVar142 * fVar165;
                      fVar237 = fVar212 * fVar319 + fVar159 * fVar165;
                      fVar231 = fVar226 - fVar102;
                      fVar236 = fVar232 - fVar296;
                      fVar279 = fVar237 - fVar302;
                      fVar102 = (((fVar102 - (fVar265 * fVar314 + fVar323 * fVar165)) * fVar263 +
                                 fVar163 * fVar231) * fVar263 +
                                (fVar231 * fVar263 +
                                ((fVar314 * fVar122 + local_288 * fVar165) - fVar226) * fVar163) *
                                fVar163) * 3.0;
                      fVar296 = (((fVar296 - (fVar275 * fVar316 + fVar324 * fVar165)) * fVar263 +
                                 fVar163 * fVar236) * fVar263 +
                                (fVar236 * fVar263 +
                                ((fVar316 * fVar140 + fStack_284 * fVar165) - fVar232) * fVar163) *
                                fVar163) * 3.0;
                      fVar263 = (((fVar302 - (fVar278 * fVar319 + fVar294 * fVar165)) * fVar263 +
                                 fVar163 * fVar279) * fVar263 +
                                (fVar279 * fVar263 +
                                ((fVar319 * fVar158 + fStack_280 * fVar165) - fVar237) * fVar163) *
                                fVar163) * 3.0;
                      pGVar12 = (context->scene->geometries).items[uVar65].ptr;
                      if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        uVar54 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (uVar54 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar302 = fVar121 * local_2a8 +
                                  fVar160 * local_2b8 + fVar164 * local_2c8 + fVar241 * local_2d8;
                        fVar314 = fVar121 * fStack_2a4 +
                                  fVar160 * fStack_2b4 + fVar164 * fStack_2c4 + fVar241 * fStack_2d4
                        ;
                        fVar121 = fVar121 * fStack_2a0 +
                                  fVar160 * fStack_2b0 + fVar164 * fStack_2c0 + fVar241 * fStack_2d0
                        ;
                        local_c8 = fVar314 * fVar102 - fVar296 * fVar302;
                        local_e8 = fVar121 * fVar296 - fVar263 * fVar314;
                        local_d8 = fVar302 * fVar263 - fVar102 * fVar121;
                        fStack_e4 = local_e8;
                        fStack_e0 = local_e8;
                        fStack_dc = local_e8;
                        fStack_d4 = local_d8;
                        fStack_d0 = local_d8;
                        fStack_cc = local_d8;
                        fStack_c4 = local_c8;
                        fStack_c0 = local_c8;
                        fStack_bc = local_c8;
                        local_b8 = fVar163;
                        fStack_b4 = fVar163;
                        fStack_b0 = fVar163;
                        fStack_ac = fVar163;
                        local_a8 = fVar165;
                        fStack_a4 = fVar165;
                        fStack_a0 = fVar165;
                        fStack_9c = fVar165;
                        local_98 = CONCAT44(uStack_2f4,local_2f8);
                        uStack_90 = CONCAT44(uStack_2ec,uStack_2f0);
                        local_88 = CONCAT44(uStack_2e4,local_2e8);
                        uStack_80 = CONCAT44(uStack_2dc,uStack_2e0);
                        local_78 = context->user->instID[0];
                        uStack_74 = local_78;
                        uStack_70 = local_78;
                        uStack_6c = local_78;
                        local_68 = context->user->instPrimID[0];
                        uStack_64 = local_68;
                        uStack_60 = local_68;
                        uStack_5c = local_68;
                        *(float *)(ray + k * 4 + 0x80) = fVar100;
                        local_418 = *local_400;
                        uStack_410 = local_400[1];
                        local_328.valid = (int *)&local_418;
                        local_328.geometryUserPtr = pGVar12->userPtr;
                        local_328.context = context->user;
                        local_328.ray = (RTCRayN *)ray;
                        local_328.hit = (RTCHitN *)&local_e8;
                        local_328.N = 4;
                        p_Var56 = pGVar12->occlusionFilterN;
                        if (p_Var56 != (RTCFilterFunctionN)0x0) {
                          p_Var56 = (RTCFilterFunctionN)(*p_Var56)(&local_328);
                        }
                        auVar96._0_4_ = -(uint)((int)local_418 == 0);
                        auVar96._4_4_ = -(uint)(local_418._4_4_ == 0);
                        auVar96._8_4_ = -(uint)((int)uStack_410 == 0);
                        auVar96._12_4_ = -(uint)(uStack_410._4_4_ == 0);
                        uVar67 = movmskps((int)p_Var56,auVar96);
                        pRVar57 = (RTCRayN *)(ulong)(uVar67 ^ 0xf);
                        if ((uVar67 ^ 0xf) == 0) {
                          auVar96 = auVar96 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var56 = context->args->filter;
                          if ((p_Var56 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var56)(&local_328);
                          }
                          auVar119._0_4_ = -(uint)((int)local_418 == 0);
                          auVar119._4_4_ = -(uint)(local_418._4_4_ == 0);
                          auVar119._8_4_ = -(uint)((int)uStack_410 == 0);
                          auVar119._12_4_ = -(uint)(uStack_410._4_4_ == 0);
                          auVar96 = auVar119 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_328.ray + 0x80) =
                               ~auVar119 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_328.ray + 0x80) & auVar119;
                          pRVar57 = local_328.ray;
                        }
                        auVar97._0_4_ = auVar96._0_4_ << 0x1f;
                        auVar97._4_4_ = auVar96._4_4_ << 0x1f;
                        auVar97._8_4_ = auVar96._8_4_ << 0x1f;
                        auVar97._12_4_ = auVar96._12_4_ << 0x1f;
                        iVar58 = movmskps((int)pRVar57,auVar97);
                        if (iVar58 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar101;
                        }
                        uVar54 = (ulong)CONCAT31((int3)((uint)iVar58 >> 8),(char)iVar58 != '\0');
                      }
                      local_54c = (uint)(byte)((byte)local_54c | (byte)uVar54);
                      uVar60 = (ulong)local_54c;
                    }
                  }
                  break;
                }
                uVar54 = uVar54 - 1;
              } while (uVar54 != 0);
            }
            else {
              bVar26 = false;
            }
          }
        }
      }
    } while (bVar26);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }